

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_read_legacy_regex(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  char *__needle;
  void *pvVar10;
  void *pvVar11;
  undefined8 extraout_RAX;
  void *pvVar12;
  undefined8 extraout_RAX_00;
  undefined1 *__n;
  undefined1 *puVar13;
  undefined1 *puVar14;
  undefined8 extraout_RAX_01;
  void *__s2;
  undefined1 *puVar15;
  undefined8 extraout_RAX_02;
  int *__haystack;
  undefined8 extraout_RAX_03;
  long *plVar16;
  undefined8 extraout_RAX_04;
  undefined8 uVar17;
  undefined8 uVar18;
  char *unaff_RBX;
  char *pcVar19;
  ulong uVar20;
  ulong uVar21;
  char *unaff_R12;
  undefined **ppuVar22;
  char *pcVar23;
  undefined **ppuVar24;
  long lVar25;
  undefined **ppuVar26;
  int *piVar27;
  int *unaff_R15;
  int *piVar28;
  double dVar29;
  int extraout_XMM0_Db;
  char *flags;
  char *pattern;
  bson_t b;
  bson_error_t error;
  code **ppcVar30;
  undefined4 uStack_5fdc;
  undefined8 uStack_5fd8;
  undefined2 uStack_5fd0;
  int iStack_5fc8;
  int iStack_5fc4;
  char acStack_5fc0 [504];
  code *pcStack_5dc8;
  undefined1 auStack_5db8 [512];
  char *pcStack_5bb8;
  code *pcStack_5bb0;
  int iStack_5ba0;
  int iStack_5b9c;
  char acStack_5b98 [504];
  long *plStack_59a0;
  char *pcStack_5998;
  char *pcStack_5990;
  undefined **ppuStack_5988;
  long lStack_5910;
  long lStack_5908;
  undefined1 auStack_5900 [128];
  undefined1 auStack_5880 [232];
  undefined1 auStack_5798 [608];
  long *plStack_5538;
  code *pcStack_5530;
  undefined1 auStack_5528 [8];
  char acStack_5520 [16];
  char *pcStack_5510;
  code *pcStack_5508;
  uint uStack_5484;
  undefined8 uStack_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  undefined8 uStack_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  undefined8 uStack_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  undefined8 uStack_5420;
  undefined8 uStack_5418;
  undefined8 uStack_5410;
  undefined8 uStack_5408;
  undefined1 auStack_53b8 [648];
  int *piStack_5130;
  char *pcStack_5128;
  undefined **ppuStack_5120;
  undefined1 *puStack_5118;
  undefined **ppuStack_5110;
  code *pcStack_5108;
  undefined1 auStack_5100 [240];
  undefined1 auStack_5010 [648];
  code *apcStack_4d88 [16];
  undefined *puStack_4d08;
  undefined1 auStack_4d00 [200];
  int iStack_4c38;
  int iStack_4c34;
  int aiStack_4c30 [160];
  int *piStack_49b0;
  double *pdStack_49a8;
  undefined **ppuStack_49a0;
  int *piStack_4998;
  int *piStack_4990;
  code *apcStack_4988 [16];
  double dStack_4908;
  int aiStack_4900 [50];
  int iStack_4838;
  int iStack_4834;
  int aiStack_4830 [160];
  undefined8 uStack_45b0;
  undefined1 *puStack_45a8;
  char *pcStack_45a0;
  char *pcStack_4598;
  undefined **ppuStack_4590;
  code *pcStack_4588;
  int iStack_4580;
  int iStack_457c;
  char acStack_4578 [504];
  undefined1 auStack_4380 [336];
  char *pcStack_4230;
  undefined1 *puStack_4228;
  undefined1 *puStack_4220;
  void *pvStack_4218;
  void *pvStack_4210;
  code *pcStack_4208;
  undefined1 auStack_4200 [128];
  char acStack_4180 [232];
  undefined1 auStack_4098 [648];
  char *pcStack_3e10;
  code *pcStack_3e08;
  undefined1 auStack_3e00 [128];
  char acStack_3d80 [224];
  int iStack_3ca0;
  int iStack_3c9c;
  char acStack_3c98 [640];
  char *pcStack_3a18;
  void *pvStack_3a10;
  code *pcStack_3a08;
  undefined1 auStack_3a00 [128];
  char acStack_3980 [232];
  undefined1 auStack_3898 [648];
  char *pcStack_3610;
  code *pcStack_3608;
  undefined1 auStack_3600 [232];
  int iStack_3518;
  int iStack_3514;
  char acStack_3510 [640];
  char *pcStack_3290;
  code *apcStack_3288 [16];
  uint uStack_3204;
  undefined1 auStack_3200 [4];
  uint uStack_31fc;
  undefined1 auStack_3138 [648];
  undefined1 *puStack_2eb0;
  undefined1 *puStack_2ea8;
  undefined1 *puStack_2ea0;
  void *pvStack_2e98;
  void *pvStack_2e90;
  code *pcStack_2e88;
  uint uStack_2e7c;
  void *pvStack_2e78;
  char *pcStack_2e70;
  void *pvStack_2e68;
  char *pcStack_2e60;
  void *pvStack_2e58;
  char *pcStack_2e50;
  undefined1 *puStack_2e48;
  char *pcStack_2e40;
  undefined1 *puStack_2e38;
  char *pcStack_2e30;
  undefined8 uStack_2e28;
  char *pcStack_2e20;
  undefined8 uStack_2e18;
  char *pcStack_2e10;
  undefined8 uStack_2e08;
  undefined1 auStack_2e00 [4];
  uint uStack_2dfc;
  undefined1 auStack_2d38 [592];
  undefined8 uStack_2ae8;
  char *pcStack_2ae0;
  char *pcStack_2ad8;
  char *pcStack_2ad0;
  char *pcStack_2ac8;
  char *pcStack_2ac0;
  char *pcStack_2ab8;
  char *pcStack_2ab0;
  char *pcStack_2aa8;
  char *pcStack_2aa0;
  char *pcStack_2a98;
  char *pcStack_2a90;
  code *apcStack_2a88 [7];
  undefined8 uStack_2a50;
  void *pvStack_2a48;
  char *pcStack_2a40;
  void *pvStack_2a38;
  char *pcStack_2a30;
  undefined8 uStack_2a28;
  char *pcStack_2a20;
  void *pvStack_2a18;
  char *pcStack_2a10;
  undefined8 uStack_2a08;
  char acStack_2a00 [4];
  uint uStack_29fc;
  undefined1 auStack_2938 [648];
  undefined **ppuStack_26b0;
  char *pcStack_26a8;
  long lStack_26a0;
  undefined1 *puStack_2698;
  undefined1 *puStack_2690;
  code *pcStack_2688;
  int iStack_2680;
  int iStack_267c;
  char acStack_2678 [504];
  undefined1 auStack_2480 [168];
  undefined8 uStack_23d8;
  long lStack_23d0;
  undefined8 uStack_23c8;
  undefined8 uStack_23c0;
  char *pcStack_23b8;
  char *pcStack_23b0;
  char *pcStack_23a8;
  char *pcStack_23a0;
  char *pcStack_2398;
  long lStack_2390;
  undefined8 uStack_2388;
  char *pcStack_2380;
  char *pcStack_2378;
  char *pcStack_2370;
  char *pcStack_2368;
  long lStack_2360;
  char *pcStack_2358;
  char *pcStack_2350;
  char *pcStack_2348;
  char *pcStack_2340;
  char *pcStack_2338;
  char *pcStack_2330;
  char *pcStack_2328;
  char *pcStack_2320;
  char *pcStack_2318;
  char *pcStack_2310;
  code *apcStack_2308 [12];
  undefined8 uStack_22a8;
  char *pcStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 uStack_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 uStack_2240;
  undefined8 uStack_2238;
  char *apcStack_2230 [22];
  char acStack_2180 [4];
  uint uStack_217c;
  undefined1 auStack_20b8 [648];
  char *pcStack_1e30;
  undefined **ppuStack_1e28;
  int **ppiStack_1e20;
  char *pcStack_1e18;
  int *piStack_1e10;
  code *pcStack_1e08;
  undefined1 auStack_1e00 [128];
  undefined1 auStack_1d80 [240];
  undefined1 auStack_1c90 [648];
  code *pcStack_1a08;
  undefined1 auStack_1a00 [128];
  char acStack_1980 [232];
  int iStack_1898;
  int iStack_1894;
  char acStack_1890 [632];
  char *pcStack_1618;
  code *apcStack_1610 [2];
  int iStack_1600;
  int iStack_15fc;
  undefined8 uStack_1428;
  char *pcStack_1420;
  undefined8 uStack_1418;
  int *piStack_1410;
  code *pcStack_1408;
  int iStack_1384;
  int aiStack_1380 [46];
  undefined8 uStack_12c8;
  int *piStack_12c0;
  char acStack_12b4 [12];
  undefined1 auStack_12a8 [648];
  char *pcStack_1020;
  char *pcStack_1018;
  int *piStack_1010;
  code *apcStack_1008 [15];
  int iStack_f90;
  int iStack_f8c;
  int *piStack_f88;
  char acStack_f80 [200];
  undefined1 auStack_eb8 [648];
  char *pcStack_c30;
  char *pcStack_c28;
  code *apcStack_c08 [14];
  int iStack_b94;
  char *pcStack_b90;
  int iStack_b84;
  char acStack_b80 [208];
  int iStack_ab0;
  int iStack_aac;
  char acStack_aa8 [640];
  char *pcStack_828;
  code *pcStack_808;
  undefined8 uStack_800;
  char *pcStack_790;
  undefined1 auStack_788 [8];
  undefined1 auStack_780 [224];
  undefined1 auStack_6a0 [648];
  char *pcStack_418;
  code *pcStack_408;
  undefined8 local_400;
  char *local_390;
  char *local_388;
  char local_380 [232];
  int local_298;
  int local_294;
  char local_290 [640];
  
  pcStack_408 = (code *)0x130f38;
  cVar1 = bson_init_from_json(local_380,"{\"a\": {\"$regex\": \"abc\", \"$options\": \"ix\"}}",
                              0xffffffffffffffff,&local_298);
  if (cVar1 == '\0') {
LAB_001310ab:
    pcStack_408 = (code *)0x1310b8;
    test_bson_json_read_legacy_regex_cold_1();
LAB_001310b8:
    pcStack_408 = (code *)0x1310bd;
    test_bson_json_read_legacy_regex_cold_4();
LAB_001310bd:
    pcStack_408 = (code *)0x1310c2;
    test_bson_json_read_legacy_regex_cold_5();
LAB_001310c2:
    pcStack_408 = (code *)0x1310ca;
    test_bson_json_read_legacy_regex_cold_10();
LAB_001310ca:
    pcStack_408 = (code *)0x1310cf;
    test_bson_json_read_legacy_regex_cold_6();
LAB_001310cf:
    pcStack_408 = (code *)0x1310d4;
    test_bson_json_read_legacy_regex_cold_7();
LAB_001310d4:
    pcStack_408 = (code *)0x1310dc;
    test_bson_json_read_legacy_regex_cold_8();
  }
  else {
    pcStack_408 = (code *)0x130f45;
    uVar5 = bson_bcone_magic();
    local_400 = 0;
    pcStack_408 = (code *)0x130f78;
    bcon_extract(local_380,"a",uVar5,10,&local_388,&local_390);
    unaff_RBX = local_388;
    if (local_388 == "abc") {
LAB_00130f9e:
      if ((local_390 != "ix") &&
         (((*local_390 != 'i' || (local_390[1] != 'x')) || (local_390[2] != '\0')))) {
LAB_001310a6:
        pcStack_408 = (code *)0x1310ab;
        test_bson_json_read_legacy_regex_cold_3();
        goto LAB_001310ab;
      }
      unaff_RBX = local_380;
      pcStack_408 = (code *)0x130fdc;
      bson_destroy(unaff_RBX);
      pcStack_408 = (code *)0x130ffa;
      cVar1 = bson_init_from_json(unaff_RBX,"{\"a\": {\"$regex\": \"abc\"}}",0xffffffffffffffff,
                                  &local_298);
      if (cVar1 != '\0') {
        pcStack_408 = (code *)0x1310a1;
        test_bson_json_read_legacy_regex_cold_11();
LAB_001310a1:
        pcStack_408 = (code *)0x1310a6;
        test_bson_json_read_legacy_regex_cold_9();
        goto LAB_001310a6;
      }
      if (local_298 != 1) goto LAB_001310b8;
      if (local_294 != 2) goto LAB_001310bd;
      unaff_RBX = local_290;
      pcStack_408 = (code *)0x131039;
      pcVar6 = strstr(unaff_RBX,"Missing \"$options\" after \"$regex\"");
      if (pcVar6 == (char *)0x0) goto LAB_001310c2;
      pcStack_408 = (code *)0x131065;
      cVar1 = bson_init_from_json(local_380,"{\"a\": {\"$options\": \"ix\"}}",0xffffffffffffffff,
                                  &local_298);
      if (cVar1 != '\0') goto LAB_001310a1;
      if (local_298 != 1) goto LAB_001310ca;
      if (local_294 != 2) goto LAB_001310cf;
      pcStack_408 = (code *)0x131090;
      pcVar6 = strstr(unaff_RBX,"Missing \"$regex\" after \"$options\"");
      if (pcVar6 != (char *)0x0) {
        return;
      }
      goto LAB_001310d4;
    }
    pcStack_408 = (code *)0x130f96;
    iVar2 = strcmp(local_388,"abc");
    if (iVar2 == 0) goto LAB_00130f9e;
  }
  pcStack_408 = test_bson_json_read_regex_options_order;
  test_bson_json_read_legacy_regex_cold_2();
  pcStack_808 = (code *)0x131119;
  pcStack_418 = unaff_RBX;
  pcStack_408 = (code *)&stack0xfffffffffffffff8;
  cVar1 = bson_init_from_json(auStack_780,"{\"a\": {\"$regex\": \"\", \"$options\": \"ism\"}}",
                              0xffffffffffffffff,auStack_6a0);
  if (cVar1 == '\0') {
    pcStack_808 = (code *)0x13122c;
    test_bson_json_read_regex_options_order_cold_1();
LAB_0013122c:
    pcStack_808 = (code *)0x131239;
    test_bson_json_read_regex_options_order_cold_3();
LAB_00131239:
    pcStack_808 = (code *)0x131241;
    test_bson_json_read_regex_options_order_cold_2();
  }
  else {
    pcStack_808 = (code *)0x131126;
    unaff_RBX = (char *)bson_bcone_magic();
    uStack_800 = 0;
    pcStack_808 = (code *)0x13115c;
    bcon_extract(auStack_780,"a",unaff_RBX,10,auStack_788,&pcStack_790);
    if (pcStack_790 != "ims") {
      pcStack_808 = (code *)0x13117a;
      iVar2 = strcmp(pcStack_790,"ims");
      if (iVar2 == 0) goto LAB_00131182;
      goto LAB_00131239;
    }
LAB_00131182:
    pcStack_808 = (code *)0x131192;
    bson_destroy(auStack_780);
    pcStack_808 = (code *)0x1311b0;
    cVar1 = bson_init_from_json(auStack_780,"{\"a\": {\"$regex\": \"\", \"$options\": \"misl\"}}",
                                0xffffffffffffffff,auStack_6a0);
    if (cVar1 == '\0') goto LAB_0013122c;
    uStack_800 = 0;
    pcStack_808 = (code *)0x1311e7;
    bcon_extract(auStack_780,"a",unaff_RBX,10,auStack_788,&pcStack_790);
    if (pcStack_790 == "ilms") {
LAB_00131209:
      pcStack_808 = (code *)0x131216;
      bson_destroy(auStack_780);
      return;
    }
    pcStack_808 = (code *)0x131205;
    iVar2 = strcmp(pcStack_790,"ilms");
    unaff_RBX = pcStack_790;
    if (iVar2 == 0) goto LAB_00131209;
  }
  pcStack_808 = test_bson_json_read_binary;
  test_bson_json_read_regex_options_order_cold_4();
  apcStack_c08[0] = (code *)0x131282;
  pcStack_828 = unaff_RBX;
  pcStack_808 = (code *)&pcStack_408;
  cVar1 = bson_init_from_json(acStack_b80,
                              "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\", \"subType\": \"05\"}}}",
                              0xffffffffffffffff,&iStack_ab0);
  if (cVar1 == '\0') {
LAB_0013148e:
    apcStack_c08[0] = (code *)0x13149b;
    test_bson_json_read_binary_cold_1();
LAB_0013149b:
    apcStack_c08[0] = (code *)0x1314a0;
    test_bson_json_read_binary_cold_2();
LAB_001314a0:
    apcStack_c08[0] = (code *)0x1314a5;
    test_bson_json_read_binary_cold_3();
LAB_001314a5:
    apcStack_c08[0] = (code *)0x1314b2;
    test_bson_json_read_binary_cold_5();
LAB_001314b2:
    apcStack_c08[0] = (code *)0x1314b7;
    test_bson_json_read_binary_cold_6();
LAB_001314b7:
    apcStack_c08[0] = (code *)0x1314bc;
    test_bson_json_read_binary_cold_7();
LAB_001314bc:
    apcStack_c08[0] = (code *)0x1314c1;
    test_bson_json_read_binary_cold_9();
LAB_001314c1:
    apcStack_c08[0] = (code *)0x1314c6;
    test_bson_json_read_binary_cold_10();
LAB_001314c6:
    apcStack_c08[0] = (code *)0x1314ce;
    test_bson_json_read_binary_cold_15();
LAB_001314ce:
    apcStack_c08[0] = (code *)0x1314d3;
    test_bson_json_read_binary_cold_11();
LAB_001314d3:
    apcStack_c08[0] = (code *)0x1314d8;
    test_bson_json_read_binary_cold_12();
LAB_001314d8:
    apcStack_c08[0] = (code *)0x1314e0;
    test_bson_json_read_binary_cold_13();
LAB_001314e0:
    apcStack_c08[0] = (code *)0x1314e8;
    test_bson_json_read_binary_cold_4();
  }
  else {
    apcStack_c08[0] = (code *)0x13128f;
    unaff_RBX = (char *)bson_bcone_magic();
    unaff_R15 = &iStack_b94;
    apcStack_c08[0] = (code *)0x0;
    bcon_extract(acStack_b80,"b",unaff_RBX,4,&iStack_b84,&pcStack_b90);
    if (iStack_b84 != 5) goto LAB_0013149b;
    if (iStack_b94 != 3) goto LAB_001314a0;
    unaff_R12 = "foo";
    if (pcStack_b90 != "foo") {
      apcStack_c08[0] = (code *)0x131303;
      iVar2 = strcmp(pcStack_b90,"foo");
      if (iVar2 == 0) goto LAB_0013130b;
      goto LAB_001314e0;
    }
LAB_0013130b:
    apcStack_c08[0] = (code *)0x13131b;
    bson_destroy(acStack_b80);
    apcStack_c08[0] = (code *)0x131339;
    cVar1 = bson_init_from_json(acStack_b80,
                                "{\"b\": {\"$binary\": {\"subType\": \"05\", \"base64\": \"Zm9v\"}}}"
                                ,0xffffffffffffffff,&iStack_ab0);
    if (cVar1 == '\0') goto LAB_001314a5;
    apcStack_c08[0] = (code *)0x0;
    bcon_extract(acStack_b80,"b",unaff_RBX,4,&iStack_b84,&pcStack_b90);
    if (iStack_b84 != 5) goto LAB_001314b2;
    if (iStack_b94 != 3) goto LAB_001314b7;
    if (pcStack_b90 == "foo") {
LAB_001313ae:
      unaff_RBX = acStack_b80;
      apcStack_c08[0] = (code *)0x1313be;
      bson_destroy(unaff_RBX);
      apcStack_c08[0] = (code *)0x1313dc;
      cVar1 = bson_init_from_json(unaff_RBX,"{\"b\": {\"$binary\": {\"subType\": \"5\"}}}",
                                  0xffffffffffffffff,&iStack_ab0);
      if (cVar1 != '\0') {
        apcStack_c08[0] = (code *)0x131489;
        test_bson_json_read_binary_cold_16();
LAB_00131489:
        apcStack_c08[0] = (code *)0x13148e;
        test_bson_json_read_binary_cold_14();
        goto LAB_0013148e;
      }
      if (iStack_ab0 != 1) goto LAB_001314bc;
      if (iStack_aac != 2) goto LAB_001314c1;
      unaff_RBX = acStack_aa8;
      apcStack_c08[0] = (code *)0x13141b;
      pcVar6 = strstr(unaff_RBX,"Missing \"base64\" after \"subType\"");
      if (pcVar6 == (char *)0x0) goto LAB_001314c6;
      apcStack_c08[0] = (code *)0x131447;
      cVar1 = bson_init_from_json(acStack_b80,"{\"b\": {\"$binary\": {\"base64\": \"Zm9v\"}}}",
                                  0xffffffffffffffff,&iStack_ab0);
      if (cVar1 != '\0') goto LAB_00131489;
      if (iStack_ab0 != 1) goto LAB_001314ce;
      if (iStack_aac != 2) goto LAB_001314d3;
      apcStack_c08[0] = (code *)0x131472;
      pcVar6 = strstr(unaff_RBX,"Missing \"subType\" after \"base64\"");
      if (pcVar6 != (char *)0x0) {
        return;
      }
      goto LAB_001314d8;
    }
    apcStack_c08[0] = (code *)0x1313a6;
    iVar2 = strcmp(pcStack_b90,"foo");
    unaff_RBX = pcStack_b90;
    if (iVar2 == 0) goto LAB_001313ae;
  }
  apcStack_c08[0] = test_bson_json_read_legacy_binary;
  test_bson_json_read_binary_cold_8();
  pcVar19 = "{\"x\": {\"$binary\": \"Zm9v\", \"$type\": \"05\"}}";
  ppuVar22 = &PTR_anon_var_dwarf_1a702_00163258;
  pcVar6 = "foo";
  pcStack_c30 = unaff_RBX;
  pcStack_c28 = unaff_R12;
  apcStack_c08[0] = (code *)&pcStack_808;
  while( true ) {
    apcStack_1008[0] = (code *)0x131541;
    cVar1 = bson_init_from_json(acStack_f80,pcVar19,0xffffffffffffffff,auStack_eb8);
    if (cVar1 == '\0') break;
    apcStack_1008[0] = (code *)0x13154e;
    uVar5 = bson_bcone_magic();
    apcStack_1008[0] = (code *)0x0;
    piStack_1010 = &iStack_f90;
    pcStack_1018 = (char *)0x131578;
    bcon_extract(acStack_f80,"x",uVar5,4,&iStack_f8c,&piStack_f88);
    if (iStack_f8c != 5) {
LAB_001315d4:
      apcStack_1008[0] = (code *)0x1315d9;
      test_bson_json_read_legacy_binary_cold_2();
      break;
    }
    if (iStack_f90 != 3) {
      apcStack_1008[0] = (code *)0x1315d4;
      test_bson_json_read_legacy_binary_cold_3();
      goto LAB_001315d4;
    }
    unaff_R15 = piStack_f88;
    if (piStack_f88 != (int *)"foo") {
      apcStack_1008[0] = (code *)0x1315a3;
      iVar2 = strcmp((char *)piStack_f88,"foo");
      if (iVar2 == 0) goto LAB_001315a7;
      goto LAB_001315e6;
    }
LAB_001315a7:
    apcStack_1008[0] = (code *)0x1315af;
    bson_destroy(acStack_f80);
    pcVar19 = *ppuVar22;
    ppuVar22 = ppuVar22 + 1;
    if (pcVar19 == (char *)0x0) {
      return;
    }
  }
  apcStack_1008[0] = (code *)0x1315e6;
  test_bson_json_read_legacy_binary_cold_1();
LAB_001315e6:
  apcStack_1008[0] = test_json_reader_new_from_file;
  test_bson_json_read_legacy_binary_cold_4();
  pcStack_1018 = "foo";
  aiStack_1380[0x1c] = 0;
  aiStack_1380[0x1d] = 0;
  aiStack_1380[0x1e] = 0;
  aiStack_1380[0x1f] = 0;
  aiStack_1380[0x18] = 0;
  aiStack_1380[0x19] = 0;
  aiStack_1380[0x1a] = 0;
  aiStack_1380[0x1b] = 0;
  aiStack_1380[0x14] = 0;
  aiStack_1380[0x15] = 0;
  aiStack_1380[0x16] = 0;
  aiStack_1380[0x17] = 0;
  aiStack_1380[0x10] = 0;
  aiStack_1380[0x11] = 0;
  aiStack_1380[0x12] = 0;
  aiStack_1380[0x13] = 0;
  aiStack_1380[0xc] = 0;
  aiStack_1380[0xd] = 0;
  aiStack_1380[0xe] = 0;
  aiStack_1380[0xf] = 0;
  aiStack_1380[8] = 0;
  aiStack_1380[9] = 0;
  aiStack_1380[10] = 0;
  aiStack_1380[0xb] = 0;
  aiStack_1380[4] = 0;
  aiStack_1380[5] = 0;
  aiStack_1380[6] = 0;
  aiStack_1380[7] = 0;
  aiStack_1380[0] = 3;
  aiStack_1380[1] = 5;
  aiStack_1380[2] = 5;
  aiStack_1380[3] = 0;
  pcStack_1408 = (code *)0x131673;
  pcStack_1020 = acStack_f80;
  piStack_1010 = unaff_R15;
  apcStack_1008[0] = (code *)apcStack_c08;
  pcVar19 = (char *)bson_json_reader_new_from_file
                              ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/test.json"
                               ,auStack_12a8);
  if (pcVar19 == (char *)0x0) {
    pcStack_1408 = (code *)0x1317bc;
    test_json_reader_new_from_file_cold_6();
    pcVar19 = acStack_f80;
LAB_001317bc:
    pcStack_1408 = (code *)0x1317c1;
    test_json_reader_new_from_file_cold_5();
LAB_001317c1:
    pcStack_1408 = (code *)0x1317d9;
    test_json_reader_new_from_file_cold_1();
LAB_001317d9:
    pcStack_1408 = (code *)0x1317de;
    test_json_reader_new_from_file_cold_3();
LAB_001317de:
    pcStack_1408 = (code *)0x1317f6;
    test_json_reader_new_from_file_cold_4();
  }
  else {
    pcStack_1408 = (code *)0x131697;
    iVar2 = bson_json_reader_read(pcVar19,aiStack_1380,auStack_12a8);
    if (iVar2 != 1) goto LAB_001317c1;
    pcStack_1408 = (code *)0x1316a5;
    pcVar6 = (char *)bson_bcone_magic();
    piStack_1410 = &iStack_1384;
    pcStack_1408 = (code *)0x0;
    uStack_1418 = 0xf;
    uStack_1428 = 0x1316e2;
    pcStack_1420 = pcVar6;
    bcon_extract(aiStack_1380,"foo",pcVar6,0,&piStack_12c0,"a");
    unaff_R15 = piStack_12c0;
    if (piStack_12c0 == (int *)0x1428c0) {
LAB_0013170c:
      if (iStack_1384 != 1) goto LAB_001317d9;
      unaff_R15 = aiStack_1380;
      pcStack_1408 = (code *)0x131729;
      bson_reinit(unaff_R15);
      pcStack_1408 = (code *)0x13173c;
      iVar2 = bson_json_reader_read(pcVar19,unaff_R15,auStack_12a8);
      if (iVar2 == 1) {
        unaff_R15 = (int *)&uStack_12c8;
        pcStack_1408 = (code *)0x131771;
        bcon_extract(aiStack_1380,"_id",pcVar6,6,unaff_R15,0);
        pcVar6 = acStack_12b4;
        pcStack_1408 = (code *)0x131788;
        bson_oid_init_from_string(pcVar6,"aabbccddeeff001122334455");
        pcStack_1408 = (code *)0x131793;
        cVar1 = bson_oid_equal(pcVar6,uStack_12c8);
        if (cVar1 != '\0') {
          pcStack_1408 = (code *)0x1317a4;
          bson_destroy(aiStack_1380);
          pcStack_1408 = (code *)0x1317ac;
          bson_json_reader_destroy(pcVar19);
          return;
        }
        goto LAB_001317bc;
      }
      goto LAB_001317de;
    }
    pcStack_1408 = (code *)0x131704;
    iVar2 = strcmp("bar",(char *)piStack_12c0);
    if (iVar2 == 0) goto LAB_0013170c;
  }
  pcStack_1408 = test_json_reader_new_from_bad_path;
  test_json_reader_new_from_file_cold_2();
  apcStack_1610[0] = (code *)0x131816;
  lVar7 = bson_json_reader_new_from_file
                    ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/does-not-exist"
                     ,&iStack_1600);
  if (lVar7 == 0) {
    if (iStack_1600 != 2) goto LAB_0013183a;
    if (iStack_15fc == 1) {
      return;
    }
  }
  else {
    apcStack_1610[0] = (code *)0x13183a;
    test_json_reader_new_from_bad_path_cold_1();
LAB_0013183a:
    apcStack_1610[0] = (code *)0x13183f;
    test_json_reader_new_from_bad_path_cold_2();
  }
  apcStack_1610[0] = test_bson_json_number_long;
  test_json_reader_new_from_bad_path_cold_3();
  pcStack_1a08 = (code *)0x131877;
  pcStack_1618 = pcVar19;
  apcStack_1610[0] = (code *)apcStack_1008;
  cVar1 = bson_init_from_json(acStack_1980,"{\"key\": {\"$numberLong\": \"4611686018427387904\"}}",
                              0xffffffffffffffff,&iStack_1898);
  if (cVar1 == '\0') {
LAB_00131c0c:
    pcStack_1a08 = (code *)0x131c19;
    test_bson_json_number_long_cold_1();
LAB_00131c19:
    pcStack_1a08 = (code *)0x131c26;
    test_bson_json_number_long_cold_6();
LAB_00131c26:
    pcStack_1a08 = (code *)0x131c2e;
    test_bson_json_number_long_cold_9();
LAB_00131c2e:
    pcStack_1a08 = (code *)0x131c3b;
    test_bson_json_number_long_cold_10();
LAB_00131c3b:
    pcStack_1a08 = (code *)0x131c43;
    test_bson_json_number_long_cold_13();
LAB_00131c43:
    pcStack_1a08 = (code *)0x131c48;
    test_bson_json_number_long_cold_14();
LAB_00131c48:
    pcStack_1a08 = (code *)0x131c4d;
    test_bson_json_number_long_cold_15();
LAB_00131c4d:
    pcStack_1a08 = (code *)0x131c55;
    test_bson_json_number_long_cold_28();
LAB_00131c55:
    pcStack_1a08 = (code *)0x131c5a;
    test_bson_json_number_long_cold_16();
LAB_00131c5a:
    pcStack_1a08 = (code *)0x131c5f;
    test_bson_json_number_long_cold_17();
LAB_00131c5f:
    pcStack_1a08 = (code *)0x131c67;
    test_bson_json_number_long_cold_26();
LAB_00131c67:
    pcStack_1a08 = (code *)0x131c6c;
    test_bson_json_number_long_cold_18();
LAB_00131c6c:
    pcStack_1a08 = (code *)0x131c71;
    test_bson_json_number_long_cold_19();
LAB_00131c71:
    pcStack_1a08 = (code *)0x131c79;
    test_bson_json_number_long_cold_24();
LAB_00131c79:
    pcStack_1a08 = (code *)0x131c7e;
    test_bson_json_number_long_cold_20();
LAB_00131c7e:
    pcStack_1a08 = (code *)0x131c83;
    test_bson_json_number_long_cold_21();
  }
  else {
    pcStack_1a08 = (code *)0x13188f;
    cVar1 = bson_iter_init(auStack_1a00,acStack_1980);
    if (cVar1 == '\0') {
      pcStack_1a08 = (code *)0x131bcb;
      test_bson_json_number_long_cold_2();
LAB_00131bcb:
      pcStack_1a08 = (code *)0x131bd0;
      test_bson_json_number_long_cold_3();
LAB_00131bd0:
      pcStack_1a08 = (code *)0x131bd5;
      test_bson_json_number_long_cold_4();
LAB_00131bd5:
      pcStack_1a08 = (code *)0x131bda;
      test_bson_json_number_long_cold_5();
LAB_00131bda:
      pcStack_1a08 = (code *)0x131bdf;
      test_bson_json_number_long_cold_31();
LAB_00131bdf:
      pcStack_1a08 = (code *)0x131be4;
      test_bson_json_number_long_cold_30();
LAB_00131be4:
      pcStack_1a08 = (code *)0x131be9;
      test_bson_json_number_long_cold_7();
LAB_00131be9:
      pcStack_1a08 = (code *)0x131bee;
      test_bson_json_number_long_cold_8();
LAB_00131bee:
      pcStack_1a08 = (code *)0x131bf3;
      test_bson_json_number_long_cold_11();
LAB_00131bf3:
      pcStack_1a08 = (code *)0x131bf8;
      test_bson_json_number_long_cold_12();
LAB_00131bf8:
      pcStack_1a08 = (code *)0x131bfd;
      test_bson_json_number_long_cold_29();
LAB_00131bfd:
      pcStack_1a08 = (code *)0x131c02;
      test_bson_json_number_long_cold_27();
LAB_00131c02:
      pcStack_1a08 = (code *)0x131c07;
      test_bson_json_number_long_cold_25();
LAB_00131c07:
      pcStack_1a08 = (code *)0x131c0c;
      test_bson_json_number_long_cold_23();
      goto LAB_00131c0c;
    }
    pcStack_1a08 = (code *)0x1318a6;
    cVar1 = bson_iter_find(auStack_1a00,"key");
    if (cVar1 == '\0') goto LAB_00131bcb;
    pcStack_1a08 = (code *)0x1318b6;
    iVar2 = bson_iter_type(auStack_1a00);
    if (iVar2 != 0x12) goto LAB_00131bd0;
    pcStack_1a08 = (code *)0x1318c7;
    lVar7 = bson_iter_int64(auStack_1a00);
    if (lVar7 != 0x4000000000000000) goto LAB_00131bd5;
    pcVar19 = acStack_1980;
    pcStack_1a08 = (code *)0x1318ea;
    bson_destroy(pcVar19);
    pcStack_1a08 = (code *)0x131908;
    cVar1 = bson_init_from_json(pcVar19,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 != '\0') goto LAB_00131bda;
    pcStack_1a08 = (code *)0x131933;
    cVar1 = bson_init_from_json(acStack_1980,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 != '\0') goto LAB_00131bdf;
    pcStack_1a08 = (code *)0x13195e;
    cVar1 = bson_init_from_json(acStack_1980,"{\"x\": {\"$numberLong\": \"9223372036854775807\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 == '\0') goto LAB_00131c19;
    pcStack_1a08 = (code *)0x13197d;
    cVar1 = bson_iter_init_find(auStack_1a00,acStack_1980,"x");
    if (cVar1 == '\0') goto LAB_00131be4;
    pcStack_1a08 = (code *)0x13198d;
    iVar2 = bson_iter_type(auStack_1a00);
    if (iVar2 != 0x12) goto LAB_00131be9;
    pcVar19 = (char *)0x7fffffffffffffff;
    pcStack_1a08 = (code *)0x1319a8;
    lVar7 = bson_iter_int64(auStack_1a00);
    if (lVar7 != 0x7fffffffffffffff) goto LAB_00131c26;
    pcStack_1a08 = (code *)0x1319d4;
    cVar1 = bson_init_from_json(acStack_1980,"{\"x\": {\"$numberLong\": \"-9223372036854775808\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 == '\0') goto LAB_00131c2e;
    pcStack_1a08 = (code *)0x1319f3;
    cVar1 = bson_iter_init_find(auStack_1a00,acStack_1980,"x");
    if (cVar1 == '\0') goto LAB_00131bee;
    pcStack_1a08 = (code *)0x131a03;
    iVar2 = bson_iter_type(auStack_1a00);
    if (iVar2 != 0x12) goto LAB_00131bf3;
    pcStack_1a08 = (code *)0x131a14;
    lVar7 = bson_iter_int64(auStack_1a00);
    pcVar19 = (char *)0x8000000000000000;
    if (lVar7 != -0x8000000000000000) goto LAB_00131c3b;
    pcVar19 = acStack_1980;
    pcStack_1a08 = (code *)0x131a30;
    bson_destroy(pcVar19);
    pcStack_1a08 = (code *)0x131a4e;
    cVar1 = bson_init_from_json(pcVar19,"{\"x\": {\"$numberLong\": \"9223372036854775808\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 != '\0') goto LAB_00131bf8;
    if (iStack_1898 != 1) goto LAB_00131c43;
    if (iStack_1894 != 2) goto LAB_00131c48;
    pcVar19 = acStack_1890;
    pcStack_1a08 = (code *)0x131a8d;
    pcVar8 = strstr(pcVar19,"Number \"9223372036854775808\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00131c4d;
    pcStack_1a08 = (code *)0x131ab9;
    cVar1 = bson_init_from_json(acStack_1980,"{\"x\": {\"$numberLong\": \"-9223372036854775809\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 != '\0') goto LAB_00131bfd;
    if (iStack_1898 != 1) goto LAB_00131c55;
    if (iStack_1894 != 2) goto LAB_00131c5a;
    pcStack_1a08 = (code *)0x131af0;
    pcVar8 = strstr(pcVar19,"Number \"-9223372036854775809\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00131c5f;
    pcStack_1a08 = (code *)0x131b1c;
    cVar1 = bson_init_from_json(acStack_1980,"{\"x\": {\"$numberLong\": \"10000000000000000000\"}}",
                                0xffffffffffffffff,&iStack_1898);
    if (cVar1 != '\0') goto LAB_00131c02;
    if (iStack_1898 != 1) goto LAB_00131c67;
    if (iStack_1894 != 2) goto LAB_00131c6c;
    pcStack_1a08 = (code *)0x131b53;
    pcVar8 = strstr(pcVar19,"Number \"10000000000000000000\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00131c71;
    pcStack_1a08 = (code *)0x131b7f;
    cVar1 = bson_init_from_json(acStack_1980,"{\"x\": -10000000000000000000}",0xffffffffffffffff,
                                &iStack_1898);
    if (cVar1 != '\0') goto LAB_00131c07;
    if (iStack_1898 != 1) goto LAB_00131c79;
    if (iStack_1894 != 2) goto LAB_00131c7e;
    pcStack_1a08 = (code *)0x131bb6;
    pcVar8 = strstr(pcVar19,"Number \"-10000000000000000000\" is out of range");
    if (pcVar8 != (char *)0x0) {
      return;
    }
  }
  pcStack_1a08 = test_bson_json_number_long_zero;
  test_bson_json_number_long_cold_22();
  pcStack_1e08 = (code *)0x131cbd;
  pcStack_1a08 = (code *)apcStack_1610;
  cVar1 = bson_init_from_json(auStack_1d80,"{ \"key\": { \"$numberLong\": \"0\" }}",
                              0xffffffffffffffff,auStack_1c90);
  if (cVar1 != '\0') {
    pcStack_1e08 = (code *)0x131cd1;
    cVar1 = bson_iter_init(auStack_1e00,auStack_1d80);
    if (cVar1 == '\0') {
      pcStack_1e08 = (code *)0x131d19;
      test_bson_json_number_long_zero_cold_2();
LAB_00131d19:
      pcStack_1e08 = (code *)0x131d1e;
      test_bson_json_number_long_zero_cold_3();
LAB_00131d1e:
      pcStack_1e08 = (code *)0x131d23;
      test_bson_json_number_long_zero_cold_4();
    }
    else {
      pcStack_1e08 = (code *)0x131ce4;
      cVar1 = bson_iter_find(auStack_1e00,"key");
      if (cVar1 == '\0') goto LAB_00131d19;
      pcStack_1e08 = (code *)0x131cf0;
      iVar2 = bson_iter_type(auStack_1e00);
      if (iVar2 != 0x12) goto LAB_00131d1e;
      pcStack_1e08 = (code *)0x131cfd;
      lVar7 = bson_iter_int64(auStack_1e00);
      if (lVar7 == 0) {
        pcStack_1e08 = (code *)0x131d0f;
        bson_destroy(auStack_1d80);
        return;
      }
    }
    pcStack_1e08 = (code *)0x131d28;
    test_bson_json_number_long_zero_cold_5();
  }
  pcStack_1e08 = test_bson_json_code;
  test_bson_json_number_long_zero_cold_1();
  apcStack_2308[0] = (code *)0x131d52;
  pcStack_1e30 = pcVar19;
  ppuStack_1e28 = ppuVar22;
  ppiStack_1e20 = &piStack_f88;
  pcStack_1e18 = pcVar6;
  piStack_1e10 = unaff_R15;
  pcStack_1e08 = (code *)&pcStack_1a08;
  lVar7 = bson_bcon_magic();
  apcStack_2308[0] = (code *)0x131d7d;
  pcStack_22a0 = (char *)bcon_new(0,"a",lVar7,0xc,"b",0);
  apcStack_2308[0] = (code *)0x131da0;
  uStack_22a8 = bcon_new(0,"a",lVar7,0xc,"b",0);
  apcStack_2308[0] = (code *)0x131dc6;
  uVar5 = bcon_new(0,"var",lVar7,0xf,1,0);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x131dec;
  uStack_2238 = bcon_new(0,"a",lVar7,0xe,"b",uVar5);
  apcStack_2308[0] = (code *)0x131e19;
  uVar9 = bcon_new(0,"var2",lVar7,0x11,2,0);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x131e3f;
  uStack_2240 = bcon_new(0,"a",lVar7,0xe,"b",uVar9);
  apcStack_2308[0] = (code *)0x0;
  pcStack_2318 = "d";
  pcStack_2320 = (char *)0xe;
  pcStack_2330 = "c";
  pcStack_2338 = (char *)0x131e89;
  pcStack_2328 = (char *)lVar7;
  pcStack_2310 = (char *)uVar9;
  uStack_2278 = uVar9;
  uStack_2248 = bcon_new(0,"a",lVar7,0xe,"b",uVar5);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = "}";
  pcStack_2320 = "}";
  pcStack_2328 = "value2";
  pcStack_2330 = (char *)0x0;
  pcStack_2340 = "key2";
  pcStack_2348 = "{";
  pcStack_2350 = "subdoc";
  pcStack_2358 = "value";
  lStack_2360 = 0;
  pcStack_2370 = "key1";
  pcStack_2378 = "{";
  pcStack_2380 = "c";
  uStack_2388 = 0x131f0d;
  pcStack_2368 = (char *)lVar7;
  pcStack_2338 = (char *)lVar7;
  uStack_2250 = bcon_new(0,"a",lVar7,0xe,"b",uVar5);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x131f51;
  uStack_2270 = uVar5;
  uStack_2258 = bcon_new(0,"a",lVar7,0xe,"b",uVar5);
  apcStack_2308[0] = (code *)0x131f7a;
  uStack_2280 = bcon_new(0,"var","{","}",0);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x131fa2;
  uStack_2260 = bcon_new(0,"a",lVar7,0xe,"b",uStack_2280);
  apcStack_2308[0] = (code *)0x0;
  pcStack_2310 = "}";
  pcStack_2318 = "}";
  pcStack_2320 = (char *)0x3;
  pcStack_2328 = (char *)0xf;
  pcStack_2338 = "z";
  pcStack_2340 = "{";
  pcStack_2348 = "d3";
  pcStack_2350 = (char *)0x1;
  pcStack_2358 = (char *)0xf;
  pcStack_2368 = "x";
  pcStack_2370 = "{";
  pcStack_2378 = "d2";
  pcStack_2380 = (char *)0x1;
  uStack_2388 = 0x11;
  pcStack_2398 = "n";
  pcStack_23a0 = "}";
  pcStack_23a8 = "{";
  pcStack_23b0 = "d";
  pcStack_23b8 = "]";
  uStack_23c0 = 2;
  uStack_23c8 = 0xf;
  uStack_23d8 = 0x132050;
  lStack_23d0 = lVar7;
  lStack_2390 = lVar7;
  lStack_2360 = lVar7;
  pcStack_2330 = (char *)lVar7;
  uStack_2288 = bcon_new(0,"arr","[",lVar7,0xf,1);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x13208c;
  uStack_2268 = bcon_new(0,"a",lVar7,0xe,"b",uStack_2288);
  apcStack_2308[0] = (code *)0x13209d;
  uStack_2290 = bson_new();
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x1320c5;
  pcVar19 = (char *)bcon_new(0,"a",lVar7,0xe,"b",uStack_2290);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = "}";
  pcStack_2320 = "c";
  pcStack_2328 = (char *)0x132108;
  uStack_2298 = bcon_new(0,"x","{","$code",lVar7,0);
  pcStack_2310 = (char *)0x0;
  pcStack_2318 = (char *)0x13212d;
  apcStack_2230[0x15] = (char *)bcon_new(0,"a",lVar7,0xe,"b",uStack_2298);
  apcStack_2230[0] = "{\"a\": {\"$code\": \"b\"}}";
  apcStack_2230[1] = pcStack_22a0;
  apcStack_2230[2] = "{\"a\": {\"$code\": \"b\\u0000c\\u0000\"}}";
  apcStack_2230[3] = (char *)uStack_22a8;
  apcStack_2230[4] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}}";
  apcStack_2230[5] = (char *)uStack_2238;
  apcStack_2230[6] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}";
  apcStack_2230[7] = (char *)uStack_2240;
  apcStack_2230[8] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"key1\": \"value\",          \"subdoc\": {\"key2\": \"value2\"}}}"
  ;
  apcStack_2230[9] = (char *)uStack_2250;
  apcStack_2230[10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"$code\": \"d\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}"
  ;
  apcStack_2230[0xb] = (char *)uStack_2248;
  apcStack_2230[0xc] = "{\"a\": {\"$scope\": {\"var\": 1},          \"$code\": \"b\"}}";
  apcStack_2230[0xd] = (char *)uStack_2258;
  apcStack_2230[0xe] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": {}}}}";
  apcStack_2230[0xf] = (char *)uStack_2260;
  apcStack_2230[0x10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"arr\": [1, 2], \"d\": {},                      \"n\": {\"$numberLong\": \"1\"},                      \"d2\": {\"x\": 1, \"d3\": {\"z\": 3}}}}}"
  ;
  apcStack_2230[0x11] = (char *)uStack_2268;
  apcStack_2230[0x12] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {}}}";
  apcStack_2230[0x13] = pcVar19;
  apcStack_2230[0x14] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"x\": {\"$code\": \"c\"}}}}";
  pcVar23 = (char *)0x8;
  pcVar6 = acStack_2180;
  pcVar8 = "b";
  while( true ) {
    apcStack_2308[0] = (code *)0x13229d;
    cVar1 = bson_init_from_json(pcVar6,*(undefined8 *)((long)&uStack_2238 + (long)pcVar23),
                                0xffffffffffffffff,auStack_20b8);
    __needle = pcVar23;
    if (cVar1 == '\0') break;
    apcStack_2308[0] = (code *)0x1322b0;
    pcStack_22a0 = (char *)bson_get_data(pcVar6);
    lVar7 = *(long *)((long)apcStack_2230 + (long)pcVar23);
    apcStack_2308[0] = (code *)0x1322c5;
    __needle = (char *)bson_get_data(lVar7);
    if (*(uint *)(lVar7 + 4) != uStack_217c) {
LAB_00132392:
      pcVar6 = acStack_2180;
      apcStack_2308[0] = (code *)0x1323a4;
      pcVar8 = (char *)bson_as_canonical_extended_json(pcVar6);
      apcStack_2308[0] = (code *)0x1323b1;
      uVar5 = bson_as_canonical_extended_json(lVar7);
      pcVar19 = pcStack_22a0;
      uVar3 = *(uint *)(lVar7 + 4);
      if (uStack_217c == 0) goto LAB_001323e2;
      uVar20 = 0;
      goto LAB_001323c8;
    }
    apcStack_2308[0] = (code *)0x1322e1;
    pvVar10 = (void *)bson_get_data(lVar7);
    apcStack_2308[0] = (code *)0x1322ec;
    pvVar11 = (void *)bson_get_data(pcVar6);
    apcStack_2308[0] = (code *)0x1322fb;
    iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(lVar7 + 4));
    if (iVar2 != 0) goto LAB_00132392;
    apcStack_2308[0] = (code *)0x13230e;
    bson_destroy(pcVar6);
    pcVar23 = pcVar23 + 0x10;
    pcVar8 = pcVar6;
    pcVar19 = __needle;
    if (pcVar23 == (char *)0xb8) {
      lVar7 = 8;
      do {
        apcStack_2308[0] = (code *)0x132331;
        bson_destroy(*(undefined8 *)((long)apcStack_2230 + lVar7));
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0xb8);
      apcStack_2308[0] = (code *)0x13234b;
      bson_destroy(uStack_2270);
      apcStack_2308[0] = (code *)0x132358;
      bson_destroy(uStack_2278);
      apcStack_2308[0] = (code *)0x132365;
      bson_destroy(uStack_2280);
      apcStack_2308[0] = (code *)0x13236f;
      bson_destroy(uStack_2288);
      apcStack_2308[0] = (code *)0x132379;
      bson_destroy(uStack_2298);
      apcStack_2308[0] = (code *)0x132383;
      bson_destroy(uStack_2290);
      return;
    }
  }
LAB_001324a3:
  apcStack_2308[0] = test_bson_json_code_errors;
  test_bson_json_code_cold_1();
  lVar25 = 8;
  pcStack_2330 = pcVar8;
  pcStack_2328 = __needle;
  pcStack_2320 = pcVar19;
  pcStack_2318 = pcVar6;
  pcStack_2310 = (char *)lVar7;
  apcStack_2308[0] = (code *)&pcStack_1e08;
  do {
    pcStack_2688 = (code *)0x1324f7;
    cVar1 = bson_init_from_json(auStack_2480,*(undefined8 *)(&UNK_00163268 + lVar25),
                                0xffffffffffffffff,&iStack_2680);
    if (cVar1 != '\0') {
      pcStack_2688 = (code *)0x132544;
      test_bson_json_code_errors_cold_3();
LAB_00132544:
      pcStack_2688 = (code *)0x132549;
      test_bson_json_code_errors_cold_2();
LAB_00132549:
      pcStack_2688 = (code *)0x132569;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_2678,
              __needle);
      pcStack_2688 = (code *)0x13256e;
      abort();
    }
    if (iStack_2680 != 1) {
      pcStack_2688 = test_bson_json_dbref;
      test_bson_json_code_errors_cold_1();
      ppuStack_26b0 = &PTR_anon_var_dwarf_1aa32_00163270;
      apcStack_2a88[0] = (code *)0x132590;
      pcStack_26a8 = __needle;
      lStack_26a0 = lVar25;
      puStack_2698 = auStack_2480;
      puStack_2690 = (undefined1 *)&iStack_2680;
      pcStack_2688 = (code *)apcStack_2308;
      uVar5 = bson_bcon_magic();
      if (oid_zero_initialized == '\0') {
        apcStack_2a88[0] = (code *)0x1325af;
        bson_oid_init_from_string(oid_zero_oid,"000000000000000000000000");
        oid_zero_initialized = '\x01';
      }
      pvVar11 = (void *)0x0;
      pcVar6 = "$ref";
      pcStack_2a90 = (char *)0x0;
      pcStack_2a98 = "}";
      pcStack_2aa0 = oid_zero_oid;
      pcStack_2aa8 = (char *)0x6;
      pcStack_2ab8 = "$id";
      pcStack_2ac0 = "collection";
      pcStack_2ac8 = (char *)0x132610;
      pcStack_2ab0 = (char *)uVar5;
      pvStack_2a48 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_2a90 = (char *)0x0;
      pcStack_2a98 = "}";
      pcStack_2aa0 = (char *)0x1;
      pcStack_2aa8 = (char *)0xf;
      pcStack_2ab8 = "$id";
      pcStack_2ac0 = "collection";
      pcStack_2ac8 = (char *)0x132660;
      pcStack_2ab0 = (char *)uVar5;
      uStack_2a50 = bcon_new(0,"key","{","$ref",uVar5,0);
      apcStack_2a88[0] = (code *)0x0;
      pcStack_2a90 = "}";
      pcStack_2a98 = "}";
      pcStack_2aa0 = (char *)0x1;
      pcStack_2aa8 = (char *)0xf;
      pcStack_2ab8 = "a";
      pcStack_2ac0 = "{";
      pcStack_2ac8 = "$id";
      pcStack_2ad0 = "collection";
      pcStack_2ad8 = (char *)0x1326b8;
      pcStack_2ab0 = (char *)uVar5;
      pvVar10 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_2a90 = (char *)0x0;
      pcStack_2a98 = "}";
      pcStack_2aa0 = (char *)0x1;
      pcStack_2aa8 = (char *)0x7;
      pcStack_2ab8 = "meta";
      pcStack_2ac0 = (char *)0x1;
      pcStack_2ac8 = (char *)0xf;
      pcStack_2ad8 = "$id";
      pcStack_2ae0 = "collection";
      uStack_2ae8 = 0x13271b;
      pcStack_2ad0 = (char *)uVar5;
      pcStack_2ab0 = (char *)uVar5;
      uStack_2a08 = bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_2a40 = 
      "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
      pvStack_2a38 = pvStack_2a48;
      pcStack_2a30 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
      uStack_2a28 = uStack_2a50;
      pcStack_2a20 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
      pvStack_2a18 = pvVar10;
      pcStack_2a10 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
      pcVar19 = "key";
      goto LAB_00132775;
    }
    if (iStack_267c != 2) goto LAB_00132544;
    __needle = *(char **)((long)&PTR_anon_var_dwarf_1aa32_00163270 + lVar25);
    pcStack_2688 = (code *)0x13251e;
    pcVar6 = strstr(acStack_2678,__needle);
    if (pcVar6 == (char *)0x0) goto LAB_00132549;
    lVar25 = lVar25 + 0x10;
    if (lVar25 == 0x98) {
      return;
    }
  } while( true );
  while( true ) {
    if (pcStack_22a0[uVar20] != __needle[uVar20]) goto LAB_00132488;
    uVar20 = uVar20 + 1;
    if (uStack_217c == (uint)uVar20) break;
LAB_001323c8:
    if (uVar3 == (uint)uVar20) break;
  }
LAB_001323e2:
  uVar4 = uStack_217c;
  if (uStack_217c < uVar3) {
    uVar4 = uVar3;
  }
  uVar20 = (ulong)(uVar4 - 1);
  while( true ) {
    apcStack_2308[0] = (code *)0x132407;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar8,uVar5);
    apcStack_2308[0] = (code *)0x13241f;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar8 = (char *)(ulong)uVar3;
    apcStack_2308[0] = (code *)0x132439;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_22a8 = CONCAT44(uStack_22a8._4_4_,uVar3);
    if (uVar3 == 0xffffffff) break;
    pcVar6 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00132494;
    pcVar8 = (char *)(ulong)uStack_217c;
    apcStack_2308[0] = (code *)0x132460;
    pcVar23 = (char *)write(uVar3,pcVar19,(size_t)pcVar8);
    if (pcVar23 != pcVar8) goto LAB_00132499;
    pcVar8 = (char *)(ulong)*(uint *)(lVar7 + 4);
    apcStack_2308[0] = (code *)0x132477;
    pcVar23 = (char *)write(uVar4,__needle,(size_t)pcVar8);
    if (pcVar23 != pcVar8) goto LAB_0013249e;
    uVar20 = (ulong)uVar4;
    apcStack_2308[0] = (code *)0x132488;
    test_bson_json_code_cold_4();
    uVar5 = extraout_RAX;
LAB_00132488:
    uVar20 = uVar20 & 0xffffffff;
  }
  apcStack_2308[0] = (code *)0x132494;
  test_bson_json_code_cold_6();
LAB_00132494:
  apcStack_2308[0] = (code *)0x132499;
  test_bson_json_code_cold_5();
LAB_00132499:
  apcStack_2308[0] = (code *)0x13249e;
  test_bson_json_code_cold_2();
LAB_0013249e:
  apcStack_2308[0] = (code *)0x1324a3;
  test_bson_json_code_cold_3();
  goto LAB_001324a3;
LAB_00132775:
  apcStack_2a88[0] = (code *)0x132791;
  cVar1 = bson_init_from_json(acStack_2a00,*(undefined8 *)((long)&pcStack_2a40 + (long)pvVar11),
                              0xffffffffffffffff,auStack_2938);
  pcVar8 = acStack_2a00;
  pvVar12 = pvVar11;
  if (cVar1 == '\0') goto LAB_0013293d;
  apcStack_2a88[0] = (code *)0x1327a4;
  pvStack_2a48 = (void *)bson_get_data(acStack_2a00);
  pcVar8 = *(char **)((long)&pvStack_2a38 + (long)pvVar11);
  apcStack_2a88[0] = (code *)0x1327b6;
  pvVar12 = (void *)bson_get_data(pcVar8);
  if (*(uint *)(pcVar8 + 4) != uStack_29fc) {
LAB_0013282b:
    pcVar6 = acStack_2a00;
    apcStack_2a88[0] = (code *)0x13283d;
    pcVar19 = (char *)bson_as_canonical_extended_json(pcVar6);
    apcStack_2a88[0] = (code *)0x13284a;
    uVar5 = bson_as_canonical_extended_json(pcVar8);
    pvVar10 = pvStack_2a48;
    uVar3 = *(uint *)(pcVar8 + 4);
    if (uStack_29fc == 0) goto LAB_00132879;
    uVar20 = 0;
    goto LAB_00132860;
  }
  apcStack_2a88[0] = (code *)0x1327cd;
  pcVar6 = (char *)bson_get_data(pcVar8);
  apcStack_2a88[0] = (code *)0x1327d8;
  pvVar10 = (void *)bson_get_data(acStack_2a00);
  apcStack_2a88[0] = (code *)0x1327e6;
  iVar2 = bcmp(pcVar6,pvVar10,(ulong)*(uint *)(pcVar8 + 4));
  if (iVar2 != 0) goto LAB_0013282b;
  apcStack_2a88[0] = (code *)0x1327f5;
  bson_destroy(acStack_2a00);
  pvVar11 = (void *)((long)pvVar11 + 0x10);
  pcVar19 = acStack_2a00;
  pvVar10 = pvVar12;
  if (pvVar11 == (void *)0x40) {
    lVar7 = 8;
    do {
      apcStack_2a88[0] = (code *)0x132812;
      bson_destroy(*(undefined8 *)((long)&pcStack_2a40 + lVar7));
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x48);
    return;
  }
  goto LAB_00132775;
  while( true ) {
    if (*(char *)((long)pvStack_2a48 + uVar20) != *(char *)((long)pvVar12 + uVar20))
    goto LAB_00132922;
    uVar20 = uVar20 + 1;
    if (uStack_29fc == (uint)uVar20) break;
LAB_00132860:
    if (uVar3 == (uint)uVar20) break;
  }
LAB_00132879:
  uVar4 = uStack_29fc;
  if (uStack_29fc < uVar3) {
    uVar4 = uVar3;
  }
  uVar20 = (ulong)(uVar4 - 1);
  while( true ) {
    apcStack_2a88[0] = (code *)0x13289e;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar19,uVar5);
    apcStack_2a88[0] = (code *)0x1328b6;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar19 = (char *)(ulong)uVar3;
    apcStack_2a88[0] = (code *)0x1328d1;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_2a50 = CONCAT44(uStack_2a50._4_4_,uVar3);
    if (uVar3 == 0xffffffff) break;
    pcVar6 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013292e;
    pcVar19 = (char *)(ulong)uStack_29fc;
    apcStack_2a88[0] = (code *)0x1328fb;
    pcVar23 = (char *)write(uVar3,pvVar10,(size_t)pcVar19);
    if (pcVar23 != pcVar19) goto LAB_00132933;
    pcVar8 = (char *)(ulong)*(uint *)(pcVar8 + 4);
    apcStack_2a88[0] = (code *)0x132911;
    pcVar23 = (char *)write(uVar4,pvVar12,(size_t)pcVar8);
    if (pcVar23 != pcVar8) goto LAB_00132938;
    uVar20 = (ulong)uVar4;
    apcStack_2a88[0] = (code *)0x132922;
    test_bson_json_dbref_cold_4();
    uVar5 = extraout_RAX_00;
LAB_00132922:
    uVar20 = uVar20 & 0xffffffff;
  }
  apcStack_2a88[0] = (code *)0x13292e;
  test_bson_json_dbref_cold_6();
LAB_0013292e:
  apcStack_2a88[0] = (code *)0x132933;
  test_bson_json_dbref_cold_5();
LAB_00132933:
  apcStack_2a88[0] = (code *)0x132938;
  test_bson_json_dbref_cold_2();
LAB_00132938:
  apcStack_2a88[0] = (code *)0x13293d;
  test_bson_json_dbref_cold_3();
LAB_0013293d:
  apcStack_2a88[0] = test_bson_json_uescape;
  test_bson_json_dbref_cold_1();
  pcStack_2e88 = (code *)0x132967;
  pcStack_2ab0 = pcVar8;
  pcStack_2aa8 = pcVar19;
  pcStack_2aa0 = pcVar6;
  pcStack_2a98 = (char *)pvVar12;
  pcStack_2a90 = (char *)pvVar10;
  apcStack_2a88[0] = (code *)&pcStack_2688;
  uVar5 = bson_bcon_magic();
  pcStack_2e88 = (code *)0x132989;
  pvStack_2e78 = (void *)bcon_new(0,"euro",uVar5,0,anon_var_dwarf_48e4 + 0xc,0);
  pcStack_2e88 = (code *)0x1329ad;
  pvVar10 = (void *)bcon_new(0,"crlf",uVar5,0,"\r\n",0);
  pcStack_2e88 = (code *)0x1329cf;
  __n = (undefined1 *)bcon_new(0,"quote",uVar5,0,"\"",0);
  pcStack_2e88 = (code *)0x1329f1;
  puVar13 = (undefined1 *)bcon_new(0,"backslash",uVar5,0,"\\",0);
  pcStack_2e88 = (code *)0x132a0f;
  uVar9 = bcon_new(0,"",uVar5,0,"",0);
  pcStack_2e88 = (code *)0x132a31;
  uVar5 = bcon_new(0,"escapes",uVar5,0,"\f\b\t",0);
  pcStack_2e88 = (code *)0x132a39;
  uStack_2e08 = bson_new();
  pcStack_2e70 = "{ \"euro\": \"\\u20AC\"}";
  pvStack_2e68 = pvStack_2e78;
  pcStack_2e60 = "{ \"crlf\": \"\\r\\n\"}";
  pcStack_2e50 = "{ \"quote\": \"\\\"\"}";
  pcStack_2e40 = "{ \"backslash\": \"\\\\\"}";
  pcStack_2e30 = "{ \"\": \"\"}";
  pcStack_2e20 = "{ \"escapes\": \"\\f\\b\\t\"}";
  pcStack_2e10 = "{ \"nil\": \"\\u0000\"}";
  pcStack_2e88 = (code *)0x132ad6;
  pvStack_2e58 = pvVar10;
  puStack_2e48 = __n;
  puStack_2e38 = puVar13;
  uStack_2e28 = uVar9;
  uStack_2e18 = uVar5;
  bson_append_utf8(uStack_2e08,"nil",0xffffffff,"",1);
  pvVar11 = (void *)0x8;
  while( true ) {
    pcStack_2e88 = (code *)0x132b00;
    cVar1 = bson_init_from_json(auStack_2e00,*(undefined8 *)((long)&pvStack_2e78 + (long)pvVar11),
                                0xffffffffffffffff,auStack_2d38);
    puVar15 = auStack_2e00;
    pvVar12 = pvVar11;
    if (cVar1 == '\0') break;
    pcStack_2e88 = (code *)0x132b13;
    pvStack_2e78 = (void *)bson_get_data(auStack_2e00);
    puVar15 = *(undefined1 **)((long)&pcStack_2e70 + (long)pvVar11);
    pcStack_2e88 = (code *)0x132b25;
    pvVar12 = (void *)bson_get_data(puVar15);
    if (*(uint *)(puVar15 + 4) != uStack_2dfc) {
LAB_00132b9a:
      puVar13 = auStack_2e00;
      pcStack_2e88 = (code *)0x132bac;
      __n = (undefined1 *)bson_as_canonical_extended_json(puVar13);
      pcStack_2e88 = (code *)0x132bb9;
      uVar5 = bson_as_canonical_extended_json(puVar15);
      pvVar10 = pvStack_2e78;
      uVar3 = *(uint *)(puVar15 + 4);
      if (uStack_2dfc == 0) goto LAB_00132be8;
      uVar20 = 0;
      goto LAB_00132bcf;
    }
    pcStack_2e88 = (code *)0x132b3c;
    puVar13 = (undefined1 *)bson_get_data(puVar15);
    pcStack_2e88 = (code *)0x132b47;
    pvVar10 = (void *)bson_get_data(auStack_2e00);
    pcStack_2e88 = (code *)0x132b55;
    iVar2 = bcmp(puVar13,pvVar10,(ulong)*(uint *)(puVar15 + 4));
    if (iVar2 != 0) goto LAB_00132b9a;
    pcStack_2e88 = (code *)0x132b64;
    bson_destroy(auStack_2e00);
    pvVar11 = (void *)((long)pvVar11 + 0x10);
    __n = auStack_2e00;
    pvVar10 = pvVar12;
    if (pvVar11 == (void *)0x78) {
      lVar7 = 8;
      do {
        pcStack_2e88 = (code *)0x132b81;
        bson_destroy(*(undefined8 *)((long)&pcStack_2e70 + lVar7));
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x78);
      return;
    }
  }
  goto LAB_00132cac;
  while( true ) {
    if (*(char *)((long)pvStack_2e78 + uVar20) != *(char *)((long)pvVar12 + uVar20))
    goto LAB_00132c91;
    uVar20 = uVar20 + 1;
    if (uStack_2dfc == (uint)uVar20) break;
LAB_00132bcf:
    if (uVar3 == (uint)uVar20) break;
  }
LAB_00132be8:
  uVar4 = uStack_2dfc;
  if (uStack_2dfc < uVar3) {
    uVar4 = uVar3;
  }
  uVar20 = (ulong)(uVar4 - 1);
  while( true ) {
    pcStack_2e88 = (code *)0x132c0d;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,__n,uVar5);
    pcStack_2e88 = (code *)0x132c25;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    pcStack_2e88 = (code *)0x132c40;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_2e7c = uVar3;
    if (uVar3 == 0xffffffff) break;
    puVar13 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00132c9d;
    __n = (undefined1 *)(ulong)uStack_2dfc;
    pcStack_2e88 = (code *)0x132c6a;
    puVar14 = (undefined1 *)write(uVar3,pvVar10,(size_t)__n);
    if (puVar14 != __n) goto LAB_00132ca2;
    puVar15 = (undefined1 *)(ulong)*(uint *)(puVar15 + 4);
    pcStack_2e88 = (code *)0x132c80;
    puVar14 = (undefined1 *)write(uVar4,pvVar12,(size_t)puVar15);
    if (puVar14 != puVar15) goto LAB_00132ca7;
    uVar20 = (ulong)uVar4;
    pcStack_2e88 = (code *)0x132c91;
    test_bson_json_uescape_cold_4();
    uVar5 = extraout_RAX_01;
LAB_00132c91:
    uVar20 = uVar20 & 0xffffffff;
  }
  pcStack_2e88 = (code *)0x132c9d;
  test_bson_json_uescape_cold_6();
LAB_00132c9d:
  pcStack_2e88 = (code *)0x132ca2;
  test_bson_json_uescape_cold_5();
LAB_00132ca2:
  pcStack_2e88 = (code *)0x132ca7;
  test_bson_json_uescape_cold_2();
LAB_00132ca7:
  pcStack_2e88 = (code *)0x132cac;
  test_bson_json_uescape_cold_3();
LAB_00132cac:
  pcStack_2e88 = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_3288[0] = (code *)0x132cd6;
  puStack_2eb0 = puVar15;
  puStack_2ea8 = __n;
  puStack_2ea0 = puVar13;
  pvStack_2e98 = pvVar12;
  pvStack_2e90 = pvVar10;
  pcStack_2e88 = (code *)apcStack_2a88;
  uVar5 = bson_bcon_magic();
  apcStack_3288[0] = (code *)0x132cf5;
  pcVar6 = (char *)bcon_new(0,anon_var_dwarf_48e4 + 0xc,uVar5,0,"euro",0);
  apcStack_3288[0] = (code *)0x132d1b;
  cVar1 = bson_init_from_json(auStack_3200,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,
                              auStack_3138);
  if (cVar1 == '\0') {
    apcStack_3288[0] = (code *)0x132e94;
    test_bson_json_uescape_key_cold_1();
  }
  else {
    apcStack_3288[0] = (code *)0x132d33;
    pvVar10 = (void *)bson_get_data(auStack_3200);
    apcStack_3288[0] = (code *)0x132d3e;
    pvVar12 = (void *)bson_get_data(pcVar6);
    if (*(uint *)(pcVar6 + 4) == uStack_31fc) {
      apcStack_3288[0] = (code *)0x132d53;
      pvVar11 = (void *)bson_get_data(pcVar6);
      apcStack_3288[0] = (code *)0x132d63;
      __s2 = (void *)bson_get_data(auStack_3200);
      apcStack_3288[0] = (code *)0x132d71;
      iVar2 = bcmp(pvVar11,__s2,(ulong)*(uint *)(pcVar6 + 4));
      if (iVar2 == 0) {
        apcStack_3288[0] = (code *)0x132d82;
        bson_destroy(auStack_3200);
        apcStack_3288[0] = (code *)0x132d8a;
        bson_destroy(pcVar6);
        return;
      }
    }
    puVar13 = auStack_3200;
    apcStack_3288[0] = (code *)0x132dab;
    __n = (undefined1 *)bson_as_canonical_extended_json(puVar13);
    apcStack_3288[0] = (code *)0x132db8;
    uVar5 = bson_as_canonical_extended_json(pcVar6);
    uVar3 = *(uint *)(pcVar6 + 4);
    if (uStack_31fc != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)pvVar10 + uVar20) != *(char *)((long)pvVar12 + uVar20))
        goto LAB_00132e88;
        uVar20 = uVar20 + 1;
      } while (uStack_31fc != (uint)uVar20);
    }
    uVar4 = uStack_31fc;
    if (uStack_31fc < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_3288[0] = (code *)0x132e04;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,__n,uVar5);
      apcStack_3288[0] = (code *)0x132e1c;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      __n = (undefined1 *)(ulong)uVar3;
      apcStack_3288[0] = (code *)0x132e37;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_3204 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar13 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_00132e99;
      __n = (undefined1 *)(ulong)uStack_31fc;
      apcStack_3288[0] = (code *)0x132e61;
      puVar15 = (undefined1 *)write(uVar3,pvVar10,(size_t)__n);
      if (puVar15 != __n) goto LAB_00132e9e;
      pcVar6 = (char *)(ulong)*(uint *)(pcVar6 + 4);
      apcStack_3288[0] = (code *)0x132e77;
      pcVar19 = (char *)write(uVar4,pvVar12,(size_t)pcVar6);
      if (pcVar19 != pcVar6) goto LAB_00132ea3;
      uVar20 = (ulong)uVar4;
      apcStack_3288[0] = (code *)0x132e88;
      test_bson_json_uescape_key_cold_4();
      uVar5 = extraout_RAX_02;
LAB_00132e88:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  apcStack_3288[0] = (code *)0x132e99;
  test_bson_json_uescape_key_cold_6();
LAB_00132e99:
  apcStack_3288[0] = (code *)0x132e9e;
  test_bson_json_uescape_key_cold_5();
LAB_00132e9e:
  apcStack_3288[0] = (code *)0x132ea3;
  test_bson_json_uescape_key_cold_2();
LAB_00132ea3:
  apcStack_3288[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_3608 = (code *)0x132ed6;
  pcStack_3290 = pcVar6;
  apcStack_3288[0] = (code *)&pcStack_2e88;
  cVar1 = bson_init_from_json(auStack_3600,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_3518);
  if (cVar1 == '\0') {
    if (iStack_3518 != 1) goto LAB_00132f22;
    if (iStack_3514 != 1) goto LAB_00132f27;
    pcVar6 = acStack_3510;
    pcStack_3608 = (code *)0x132f09;
    pcVar19 = strstr(pcVar6,"UESCAPE_TOOSHORT");
    if (pcVar19 != (char *)0x0) {
      pcStack_3608 = (code *)0x132f16;
      bson_destroy(auStack_3600);
      return;
    }
  }
  else {
    pcStack_3608 = (code *)0x132f22;
    test_bson_json_uescape_bad_cold_4();
LAB_00132f22:
    pcStack_3608 = (code *)0x132f27;
    test_bson_json_uescape_bad_cold_1();
LAB_00132f27:
    pcStack_3608 = (code *)0x132f2c;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_3608 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_3a08 = (code *)0x132f67;
  pcStack_3610 = pcVar6;
  pcStack_3608 = (code *)apcStack_3288;
  cVar1 = bson_init_from_json(acStack_3980,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_3898);
  if (cVar1 == '\0') {
LAB_00133159:
    pcStack_3a08 = (code *)0x133166;
    test_bson_json_int32_cold_1();
LAB_00133166:
    pcStack_3a08 = (code *)0x13316e;
    test_bson_json_int32_cold_4();
LAB_0013316e:
    pcStack_3a08 = (code *)0x13317b;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_3a08 = (code *)0x132f86;
    cVar1 = bson_iter_init_find(auStack_3a00,acStack_3980,"x");
    if (cVar1 == '\0') {
      pcStack_3a08 = (code *)0x133136;
      test_bson_json_int32_cold_2();
LAB_00133136:
      pcStack_3a08 = (code *)0x13313b;
      test_bson_json_int32_cold_3();
LAB_0013313b:
      pcStack_3a08 = (code *)0x133140;
      test_bson_json_int32_cold_6();
LAB_00133140:
      pcStack_3a08 = (code *)0x133145;
      test_bson_json_int32_cold_7();
      pcStack_3a08 = (code *)0x13314a;
      test_bson_json_int32_cold_10();
      pcStack_3a08 = (code *)0x13314f;
      test_bson_json_int32_cold_11();
      pcStack_3a08 = (code *)0x133154;
      test_bson_json_int32_cold_14();
      pcStack_3a08 = (code *)0x133159;
      test_bson_json_int32_cold_15();
      goto LAB_00133159;
    }
    pcStack_3a08 = (code *)0x132f96;
    iVar2 = bson_iter_type(auStack_3a00);
    if (iVar2 != 0x10) goto LAB_00133136;
    pcStack_3a08 = (code *)0x132fa7;
    iVar2 = bson_iter_int32(auStack_3a00);
    if (iVar2 != 0x7fffffff) goto LAB_00133166;
    pcVar6 = acStack_3980;
    pcStack_3a08 = (code *)0x132fc2;
    bson_destroy(pcVar6);
    pcStack_3a08 = (code *)0x132fe0;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_3898);
    if (cVar1 == '\0') goto LAB_0013316e;
    pcStack_3a08 = (code *)0x132fff;
    cVar1 = bson_iter_init_find(auStack_3a00,acStack_3980,"x");
    if (cVar1 == '\0') goto LAB_0013313b;
    pcStack_3a08 = (code *)0x13300f;
    iVar2 = bson_iter_type(auStack_3a00);
    if (iVar2 != 0x10) goto LAB_00133140;
    pcStack_3a08 = (code *)0x133020;
    bson_iter_int32(auStack_3a00);
  }
  pcStack_3a08 = (code *)0x133183;
  test_bson_json_int32_cold_8();
  pcStack_3a08 = (code *)0x133190;
  test_bson_json_int32_cold_9();
  pcStack_3a08 = (code *)0x133198;
  test_bson_json_int32_cold_12();
  pcStack_3a08 = (code *)0x1331a5;
  test_bson_json_int32_cold_13();
  pcStack_3a08 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_3e08 = (code *)0x1331e2;
  pcStack_3a18 = pcVar6;
  pvStack_3a10 = pvVar12;
  pcStack_3a08 = (code *)&pcStack_3608;
  cVar1 = bson_init_from_json(acStack_3d80,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_3ca0);
  if (cVar1 == '\0') {
LAB_0013347b:
    pcStack_3e08 = (code *)0x133488;
    test_bson_json_int64_cold_1();
LAB_00133488:
    pcStack_3e08 = (code *)0x133490;
    test_bson_json_int64_cold_4();
LAB_00133490:
    pcStack_3e08 = (code *)0x13349d;
    test_bson_json_int64_cold_5();
LAB_0013349d:
    pcStack_3e08 = (code *)0x1334a5;
    test_bson_json_int64_cold_8();
LAB_001334a5:
    pcStack_3e08 = (code *)0x1334aa;
    test_bson_json_int64_cold_9();
LAB_001334aa:
    pcStack_3e08 = (code *)0x1334af;
    test_bson_json_int64_cold_10();
LAB_001334af:
    pcStack_3e08 = (code *)0x1334b7;
    test_bson_json_int64_cold_23();
LAB_001334b7:
    pcStack_3e08 = (code *)0x1334bc;
    test_bson_json_int64_cold_11();
LAB_001334bc:
    pcStack_3e08 = (code *)0x1334c1;
    test_bson_json_int64_cold_12();
LAB_001334c1:
    pcStack_3e08 = (code *)0x1334c9;
    test_bson_json_int64_cold_21();
LAB_001334c9:
    pcStack_3e08 = (code *)0x1334ce;
    test_bson_json_int64_cold_13();
LAB_001334ce:
    pcStack_3e08 = (code *)0x1334d3;
    test_bson_json_int64_cold_14();
LAB_001334d3:
    pcStack_3e08 = (code *)0x1334db;
    test_bson_json_int64_cold_19();
LAB_001334db:
    pcStack_3e08 = (code *)0x1334e0;
    test_bson_json_int64_cold_15();
LAB_001334e0:
    pcStack_3e08 = (code *)0x1334e5;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_3e08 = (code *)0x133201;
    cVar1 = bson_iter_init_find(auStack_3e00,acStack_3d80,"x");
    if (cVar1 == '\0') {
      pcStack_3e08 = (code *)0x133458;
      test_bson_json_int64_cold_2();
LAB_00133458:
      pcStack_3e08 = (code *)0x13345d;
      test_bson_json_int64_cold_3();
LAB_0013345d:
      pcStack_3e08 = (code *)0x133462;
      test_bson_json_int64_cold_6();
LAB_00133462:
      pcStack_3e08 = (code *)0x133467;
      test_bson_json_int64_cold_7();
LAB_00133467:
      pcStack_3e08 = (code *)0x13346c;
      test_bson_json_int64_cold_24();
LAB_0013346c:
      pcStack_3e08 = (code *)0x133471;
      test_bson_json_int64_cold_22();
LAB_00133471:
      pcStack_3e08 = (code *)0x133476;
      test_bson_json_int64_cold_20();
LAB_00133476:
      pcStack_3e08 = (code *)0x13347b;
      test_bson_json_int64_cold_18();
      goto LAB_0013347b;
    }
    pcStack_3e08 = (code *)0x133211;
    iVar2 = bson_iter_type(auStack_3e00);
    if (iVar2 != 0x12) goto LAB_00133458;
    pvVar12 = (void *)0x7fffffffffffffff;
    pcStack_3e08 = (code *)0x13322c;
    lVar7 = bson_iter_int64(auStack_3e00);
    if (lVar7 != 0x7fffffffffffffff) goto LAB_00133488;
    pcVar6 = acStack_3d80;
    pcStack_3e08 = (code *)0x133245;
    bson_destroy(pcVar6);
    pcStack_3e08 = (code *)0x133263;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_3ca0);
    if (cVar1 == '\0') goto LAB_00133490;
    pcStack_3e08 = (code *)0x133282;
    cVar1 = bson_iter_init_find(auStack_3e00,acStack_3d80,"x");
    if (cVar1 == '\0') goto LAB_0013345d;
    pcStack_3e08 = (code *)0x133292;
    iVar2 = bson_iter_type(auStack_3e00);
    if (iVar2 != 0x12) goto LAB_00133462;
    pcStack_3e08 = (code *)0x1332a3;
    lVar7 = bson_iter_int64(auStack_3e00);
    pvVar12 = (void *)0x8000000000000000;
    if (lVar7 != -0x8000000000000000) goto LAB_0013349d;
    pcVar6 = acStack_3d80;
    pcStack_3e08 = (code *)0x1332bf;
    bson_destroy(pcVar6);
    pcStack_3e08 = (code *)0x1332dd;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_3ca0);
    if (cVar1 != '\0') goto LAB_00133467;
    if (iStack_3ca0 != 1) goto LAB_001334a5;
    if (iStack_3c9c != 2) goto LAB_001334aa;
    pcVar6 = acStack_3c98;
    pcStack_3e08 = (code *)0x13331c;
    pcVar19 = strstr(pcVar6,"Number \"9223372036854775808\" is out of range");
    if (pcVar19 == (char *)0x0) goto LAB_001334af;
    pcStack_3e08 = (code *)0x133348;
    cVar1 = bson_init_from_json(acStack_3d80,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_3ca0);
    if (cVar1 != '\0') goto LAB_0013346c;
    if (iStack_3ca0 != 1) goto LAB_001334b7;
    if (iStack_3c9c != 2) goto LAB_001334bc;
    pcStack_3e08 = (code *)0x13337f;
    pcVar19 = strstr(pcVar6,"Number \"-9223372036854775809\" is out of range");
    if (pcVar19 == (char *)0x0) goto LAB_001334c1;
    pcStack_3e08 = (code *)0x1333ab;
    cVar1 = bson_init_from_json(acStack_3d80,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_3ca0);
    if (cVar1 != '\0') goto LAB_00133471;
    if (iStack_3ca0 != 1) goto LAB_001334c9;
    if (iStack_3c9c != 2) goto LAB_001334ce;
    pcStack_3e08 = (code *)0x1333e2;
    pcVar19 = strstr(pcVar6,"Number \"10000000000000000000\" is out of range");
    if (pcVar19 == (char *)0x0) goto LAB_001334d3;
    pcStack_3e08 = (code *)0x13340e;
    cVar1 = bson_init_from_json(acStack_3d80,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_3ca0);
    if (cVar1 != '\0') goto LAB_00133476;
    if (iStack_3ca0 != 1) goto LAB_001334db;
    if (iStack_3c9c != 2) goto LAB_001334e0;
    pcStack_3e08 = (code *)0x133441;
    pcVar19 = strstr(pcVar6,"Number \"-10000000000000000000\" is out of range");
    if (pcVar19 != (char *)0x0) {
      return;
    }
  }
  pcStack_3e08 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_4208 = (code *)0x133520;
  pcStack_3e10 = pcVar6;
  pcStack_3e08 = (code *)&pcStack_3a08;
  cVar1 = bson_init_from_json(acStack_4180,"{ \"x\": 1 }",0xffffffffffffffff,auStack_4098);
  if (cVar1 == '\0') {
LAB_001337c5:
    pcStack_4208 = (code *)0x1337d2;
    test_bson_json_double_cold_1();
LAB_001337d2:
    pcStack_4208 = (code *)0x1337da;
    test_bson_json_double_cold_4();
LAB_001337da:
    pcStack_4208 = (code *)0x1337e7;
    test_bson_json_double_cold_5();
LAB_001337e7:
    pcStack_4208 = (code *)0x1337ef;
    test_bson_json_double_cold_8();
LAB_001337ef:
    pcStack_4208 = (code *)0x1337fc;
    test_bson_json_double_cold_9();
LAB_001337fc:
    pcStack_4208 = (code *)0x133804;
    test_bson_json_double_cold_12();
LAB_00133804:
    pcStack_4208 = (code *)0x133811;
    test_bson_json_double_cold_13();
LAB_00133811:
    pcStack_4208 = (code *)0x133819;
    test_bson_json_double_cold_16();
LAB_00133819:
    pcStack_4208 = (code *)0x133826;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_4208 = (code *)0x13353f;
    cVar1 = bson_iter_init_find(auStack_4200,acStack_4180,"x");
    if (cVar1 == '\0') {
      pcStack_4208 = (code *)0x133793;
      test_bson_json_double_cold_2();
LAB_00133793:
      pcStack_4208 = (code *)0x133798;
      test_bson_json_double_cold_3();
LAB_00133798:
      pcStack_4208 = (code *)0x13379d;
      test_bson_json_double_cold_6();
LAB_0013379d:
      pcStack_4208 = (code *)0x1337a2;
      test_bson_json_double_cold_7();
LAB_001337a2:
      pcStack_4208 = (code *)0x1337a7;
      test_bson_json_double_cold_10();
LAB_001337a7:
      pcStack_4208 = (code *)0x1337ac;
      test_bson_json_double_cold_11();
LAB_001337ac:
      pcStack_4208 = (code *)0x1337b1;
      test_bson_json_double_cold_14();
LAB_001337b1:
      pcStack_4208 = (code *)0x1337b6;
      test_bson_json_double_cold_15();
LAB_001337b6:
      pcStack_4208 = (code *)0x1337bb;
      test_bson_json_double_cold_18();
LAB_001337bb:
      pcStack_4208 = (code *)0x1337c0;
      test_bson_json_double_cold_19();
LAB_001337c0:
      pcStack_4208 = (code *)0x1337c5;
      test_bson_json_double_cold_21();
      goto LAB_001337c5;
    }
    pcStack_4208 = (code *)0x13354f;
    iVar2 = bson_iter_type(auStack_4200);
    if (iVar2 != 0x10) goto LAB_00133793;
    pcStack_4208 = (code *)0x133560;
    iVar2 = bson_iter_int32(auStack_4200);
    if (iVar2 != 1) goto LAB_001337d2;
    pcVar6 = acStack_4180;
    pcStack_4208 = (code *)0x133579;
    bson_destroy(pcVar6);
    pcStack_4208 = (code *)0x133597;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_4098);
    if (cVar1 == '\0') goto LAB_001337da;
    pcStack_4208 = (code *)0x1335b6;
    cVar1 = bson_iter_init_find(auStack_4200,acStack_4180,"x");
    if (cVar1 == '\0') goto LAB_00133798;
    pcStack_4208 = (code *)0x1335c6;
    iVar2 = bson_iter_type(auStack_4200);
    if (iVar2 != 0x12) goto LAB_0013379d;
    pcStack_4208 = (code *)0x1335d7;
    lVar7 = bson_iter_int64(auStack_4200);
    if (lVar7 != 0x100000000) goto LAB_001337e7;
    pcVar6 = acStack_4180;
    pcStack_4208 = (code *)0x1335fa;
    bson_destroy(pcVar6);
    pcStack_4208 = (code *)0x133618;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_4098);
    if (cVar1 == '\0') goto LAB_001337ef;
    pcStack_4208 = (code *)0x133637;
    cVar1 = bson_iter_init_find(auStack_4200,acStack_4180,"x");
    if (cVar1 == '\0') goto LAB_001337a2;
    pcStack_4208 = (code *)0x133647;
    iVar2 = bson_iter_type(auStack_4200);
    if (iVar2 != 1) goto LAB_001337a7;
    pcStack_4208 = (code *)0x133658;
    dVar29 = (double)bson_iter_double(auStack_4200);
    if ((dVar29 != 1.0) || (NAN(dVar29))) goto LAB_001337fc;
    pcVar6 = acStack_4180;
    pcStack_4208 = (code *)0x13367c;
    bson_destroy(pcVar6);
    pcStack_4208 = (code *)0x13369a;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_4098);
    if (cVar1 == '\0') goto LAB_00133804;
    pcStack_4208 = (code *)0x1336b9;
    cVar1 = bson_iter_init_find(auStack_4200,acStack_4180,"x");
    if (cVar1 == '\0') goto LAB_001337ac;
    pcStack_4208 = (code *)0x1336c9;
    iVar2 = bson_iter_type(auStack_4200);
    if (iVar2 != 1) goto LAB_001337b1;
    pcStack_4208 = (code *)0x1336da;
    dVar29 = (double)bson_iter_double(auStack_4200);
    if ((dVar29 != 0.0) || (NAN(dVar29))) goto LAB_00133811;
    pcVar6 = acStack_4180;
    pcStack_4208 = (code *)0x1336fe;
    bson_destroy(pcVar6);
    pcStack_4208 = (code *)0x13371c;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_4098);
    if (cVar1 == '\0') goto LAB_00133819;
    pcStack_4208 = (code *)0x13373b;
    cVar1 = bson_iter_init_find(auStack_4200,acStack_4180,"x");
    if (cVar1 == '\0') goto LAB_001337b6;
    pcStack_4208 = (code *)0x133747;
    iVar2 = bson_iter_type(auStack_4200);
    if (iVar2 != 1) goto LAB_001337bb;
    pcStack_4208 = (code *)0x133754;
    dVar29 = (double)bson_iter_double(auStack_4200);
    if ((dVar29 == 0.0) && (!NAN(dVar29))) {
      pcStack_4208 = (code *)0x133770;
      bson_iter_double(auStack_4200);
      if (extraout_XMM0_Db < 0) {
        pcStack_4208 = (code *)0x133787;
        bson_destroy(acStack_4180);
        return;
      }
      goto LAB_001337c0;
    }
  }
  pcStack_4208 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar19 = "2e400";
  ppuVar22 = &PTR_anon_var_dwarf_1aedf_00163308;
  pcStack_4230 = pcVar6;
  puStack_4228 = __n;
  puStack_4220 = puVar13;
  pvStack_4218 = pvVar12;
  pvStack_4210 = pvVar10;
  pcStack_4208 = (code *)&pcStack_3e08;
  while( true ) {
    pcStack_4588 = (code *)0x13386c;
    uVar5 = bson_strdup_printf("{ \"d\" : %s }",pcVar19);
    pcStack_4588 = (code *)0x133889;
    cVar1 = bson_init_from_json(auStack_4380,uVar5,0xffffffffffffffff,&iStack_4580);
    if (cVar1 != '\0') break;
    if (iStack_4580 != 1) goto LAB_00133953;
    if (iStack_457c != 2) goto LAB_0013394e;
    pcStack_4588 = (code *)0x1338b7;
    pcVar6 = strstr(acStack_4578,"out of range");
    if (pcVar6 == (char *)0x0) goto LAB_00133958;
    pcStack_4588 = (code *)0x1338c8;
    bson_free(uVar5);
    pcStack_4588 = (code *)0x1338d9;
    uVar5 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar19);
    pcStack_4588 = (code *)0x1338f6;
    cVar1 = bson_init_from_json(auStack_4380,uVar5,0xffffffffffffffff,&iStack_4580);
    if (cVar1 != '\0') goto LAB_00133949;
    if (iStack_4580 != 1) goto LAB_00133967;
    if (iStack_457c != 2) goto LAB_00133962;
    pcStack_4588 = (code *)0x133918;
    pcVar6 = strstr(acStack_4578,"out of range");
    if (pcVar6 == (char *)0x0) goto LAB_0013396c;
    pcStack_4588 = (code *)0x133925;
    bson_free(uVar5);
    pcVar19 = *ppuVar22;
    ppuVar22 = ppuVar22 + 1;
    if (pcVar19 == (char *)0x0) {
      return;
    }
  }
  pcStack_4588 = (code *)0x133949;
  test_bson_json_double_overflow_cold_8();
LAB_00133949:
  pcStack_4588 = (code *)0x13394e;
  test_bson_json_double_overflow_cold_6();
LAB_0013394e:
  pcStack_4588 = (code *)0x133953;
  test_bson_json_double_overflow_cold_2();
LAB_00133953:
  pcStack_4588 = (code *)0x133958;
  test_bson_json_double_overflow_cold_1();
LAB_00133958:
  pcStack_4588 = (code *)0x133962;
  test_bson_json_double_overflow_cold_7();
LAB_00133962:
  pcStack_4588 = (code *)0x133967;
  test_bson_json_double_overflow_cold_4();
LAB_00133967:
  pcStack_4588 = (code *)0x13396c;
  test_bson_json_double_overflow_cold_3();
LAB_0013396c:
  pcStack_4588 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_45a0 = "out of range";
  pcVar8 = "{ \"d\": NaN }";
  ppuVar26 = &PTR_anon_var_dwarf_1af33_00163328;
  __haystack = aiStack_4900;
  piVar27 = &iStack_4838;
  piVar28 = (int *)0x14c766;
  pcVar6 = (char *)&dStack_4908;
  uStack_45b0 = uVar5;
  puStack_45a8 = (undefined1 *)&iStack_4580;
  pcStack_4598 = pcVar19;
  ppuStack_4590 = ppuVar22;
  pcStack_4588 = (code *)&pcStack_4208;
  do {
    apcStack_4988[0] = (code *)0x1339ca;
    cVar1 = bson_init_from_json(__haystack,pcVar8,0xffffffffffffffff,piVar27);
    if (cVar1 == '\0') {
      apcStack_4988[0] = (code *)0x133b2b;
      test_bson_json_nan_cold_1();
LAB_00133b2b:
      apcStack_4988[0] = (code *)0x133b30;
      test_bson_json_nan_cold_2();
LAB_00133b30:
      apcStack_4988[0] = (code *)0x133b35;
      test_bson_json_nan_cold_3();
      goto LAB_00133b35;
    }
    apcStack_4988[0] = (code *)0x1339d7;
    uVar5 = bson_bcone_magic();
    apcStack_4988[0] = (code *)0x1339f2;
    cVar1 = bcon_extract(__haystack,"d",uVar5,1,pcVar6,0);
    if (cVar1 == '\0') goto LAB_00133b2b;
    if (!NAN(dStack_4908) && !NAN(dStack_4908)) goto LAB_00133b30;
    apcStack_4988[0] = (code *)0x133a12;
    bson_destroy(__haystack);
    pcVar8 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar19 = "{ \"d\": NaNn }";
  ppuVar26 = &PTR_anon_var_dwarf_1af63_00163358;
  __haystack = aiStack_4830;
  piVar27 = aiStack_4900;
  piVar28 = &iStack_4838;
  pcVar6 = "Got parse error at";
  do {
    apcStack_4988[0] = (code *)0x133a5e;
    cVar1 = bson_init_from_json(piVar27,pcVar19,0xffffffffffffffff,piVar28);
    if (cVar1 != '\0') goto LAB_00133b35;
    if (iStack_4838 != 1) goto LAB_00133b4c;
    if (iStack_4834 != 1) goto LAB_00133b3f;
    apcStack_4988[0] = (code *)0x133a91;
    pcVar19 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar19 == (char *)0x0) goto LAB_00133b44;
    pcVar19 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
  } while (pcVar19 != (char *)0x0);
  pcVar19 = "{ \"d\": nu";
  ppuVar26 = &PTR_anon_var_dwarf_1afab_00163398;
  piVar27 = aiStack_4900;
  piVar28 = &iStack_4838;
  pcVar6 = "Incomplete JSON";
  while( true ) {
    apcStack_4988[0] = (code *)0x133ade;
    cVar1 = bson_init_from_json(piVar27,pcVar19,0xffffffffffffffff,piVar28);
    if (cVar1 != '\0') break;
    if (iStack_4838 != 1) goto LAB_00133b5e;
    if (iStack_4834 != 1) goto LAB_00133b51;
    apcStack_4988[0] = (code *)0x133b05;
    pcVar19 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar19 == (char *)0x0) goto LAB_00133b56;
    pcVar19 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
    if (pcVar19 == (char *)0x0) {
      return;
    }
  }
LAB_00133b3a:
  apcStack_4988[0] = (code *)0x133b3f;
  test_bson_json_nan_cold_9();
LAB_00133b3f:
  apcStack_4988[0] = (code *)0x133b44;
  test_bson_json_nan_cold_5();
LAB_00133b44:
  apcStack_4988[0] = (code *)0x133b4c;
  test_bson_json_nan_cold_10();
LAB_00133b4c:
  apcStack_4988[0] = (code *)0x133b51;
  test_bson_json_nan_cold_4();
LAB_00133b51:
  apcStack_4988[0] = (code *)0x133b56;
  test_bson_json_nan_cold_7();
LAB_00133b56:
  apcStack_4988[0] = (code *)0x133b5e;
  test_bson_json_nan_cold_8();
LAB_00133b5e:
  apcStack_4988[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar19 = "{ \"d\": Infinity }";
  ppuVar22 = &PTR_anon_var_dwarf_1b023_001633b8;
  piStack_49b0 = __haystack;
  pdStack_49a8 = (double *)pcVar6;
  ppuStack_49a0 = ppuVar26;
  piStack_4998 = piVar27;
  piStack_4990 = piVar28;
  apcStack_4988[0] = (code *)&pcStack_4588;
  do {
    apcStack_4d88[0] = (code *)0x133bb4;
    cVar1 = bson_init_from_json(auStack_4d00,pcVar19,0xffffffffffffffff,&iStack_4c38);
    if (cVar1 == '\0') {
      apcStack_4d88[0] = (code *)0x133dd5;
      test_bson_json_infinity_cold_1();
LAB_00133dd5:
      apcStack_4d88[0] = (code *)0x133dda;
      test_bson_json_infinity_cold_2();
LAB_00133dda:
      apcStack_4d88[0] = (code *)0x133ddf;
      test_bson_json_infinity_cold_3();
      goto LAB_00133ddf;
    }
    apcStack_4d88[0] = (code *)0x133bc1;
    __haystack = (int *)bson_bcone_magic();
    apcStack_4d88[0] = (code *)0x133bdf;
    cVar1 = bcon_extract(auStack_4d00,"d",__haystack,1,&puStack_4d08,0);
    if (cVar1 == '\0') goto LAB_00133dd5;
    if ((NAN((double)puStack_4d08)) ||
       (!NAN((double)puStack_4d08 - (double)puStack_4d08) &&
        !NAN((double)puStack_4d08 - (double)puStack_4d08))) goto LAB_00133dda;
    apcStack_4d88[0] = (code *)0x133c0d;
    bson_destroy(auStack_4d00);
    pcVar19 = *ppuVar22;
    ppuVar22 = ppuVar22 + 1;
  } while (pcVar19 != (char *)0x0);
  pcVar6 = "{ \"d\": -Infinity }";
  ppuVar22 = &PTR_anon_var_dwarf_1b047_001633d8;
  do {
    apcStack_4d88[0] = (code *)0x133c52;
    cVar1 = bson_init_from_json(auStack_4d00,pcVar6,0xffffffffffffffff,&iStack_4c38);
    if (cVar1 == '\0') goto LAB_00133ddf;
    apcStack_4d88[0] = (code *)0x133c75;
    cVar1 = bcon_extract(auStack_4d00,"d",__haystack,1,&puStack_4d08,0);
    if (cVar1 == '\0') goto LAB_00133de4;
    if ((NAN((double)puStack_4d08)) || (!NAN((double)puStack_4d08 - (double)puStack_4d08)))
    goto LAB_00133de9;
    if (0.0 <= (double)puStack_4d08) goto LAB_00133dee;
    apcStack_4d88[0] = (code *)0x133cb5;
    bson_destroy(auStack_4d00);
    pcVar6 = *ppuVar22;
    ppuVar22 = ppuVar22 + 1;
  } while (pcVar6 != (char *)0x0);
  pcVar19 = "{ \"d\": Infinityy }";
  ppuVar26 = &PTR_anon_var_dwarf_1b06b_001633f8;
  __haystack = aiStack_4c30;
  ppuVar22 = (undefined **)&iStack_4c38;
  pcVar6 = "Got parse error at";
  do {
    apcStack_4d88[0] = (code *)0x133d04;
    cVar1 = bson_init_from_json(auStack_4d00,pcVar19,0xffffffffffffffff,ppuVar22);
    if (cVar1 != '\0') goto LAB_00133df3;
    if (iStack_4c38 != 1) goto LAB_00133e0a;
    if (iStack_4c34 != 1) goto LAB_00133dfd;
    apcStack_4d88[0] = (code *)0x133d37;
    pcVar19 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar19 == (char *)0x0) goto LAB_00133e02;
    pcVar19 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
  } while (pcVar19 != (char *)0x0);
  pcVar19 = "{ \"d\": In";
  ppuVar26 = &PTR_anon_var_dwarf_1b0cb_00163448;
  ppuVar22 = (undefined **)&iStack_4c38;
  pcVar6 = "Incomplete JSON";
  while( true ) {
    apcStack_4d88[0] = (code *)0x133d84;
    cVar1 = bson_init_from_json(auStack_4d00,pcVar19,0xffffffffffffffff,ppuVar22);
    if (cVar1 != '\0') break;
    if (iStack_4c38 != 1) goto LAB_00133e1c;
    if (iStack_4c34 != 1) goto LAB_00133e0f;
    apcStack_4d88[0] = (code *)0x133daf;
    pcVar19 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar19 == (char *)0x0) goto LAB_00133e14;
    pcVar19 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
    if (pcVar19 == (char *)0x0) {
      return;
    }
  }
LAB_00133df8:
  apcStack_4d88[0] = (code *)0x133dfd;
  test_bson_json_infinity_cold_13();
LAB_00133dfd:
  apcStack_4d88[0] = (code *)0x133e02;
  test_bson_json_infinity_cold_9();
LAB_00133e02:
  apcStack_4d88[0] = (code *)0x133e0a;
  test_bson_json_infinity_cold_14();
LAB_00133e0a:
  apcStack_4d88[0] = (code *)0x133e0f;
  test_bson_json_infinity_cold_8();
LAB_00133e0f:
  apcStack_4d88[0] = (code *)0x133e14;
  test_bson_json_infinity_cold_11();
LAB_00133e14:
  apcStack_4d88[0] = (code *)0x133e1c;
  test_bson_json_infinity_cold_12();
LAB_00133e1c:
  puVar13 = auStack_4d00;
  apcStack_4d88[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_5108 = (code *)0x133e4e;
  apcStack_4d88[0] = (code *)apcStack_4988;
  cVar1 = bson_init_from_json(auStack_5100,"{ \"x\": null }",0xffffffffffffffff,auStack_5010);
  if (cVar1 == '\0') {
    pcStack_5108 = (code *)0x133e89;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_5108 = (code *)0x133e57;
    uVar5 = bson_bcone_magic();
    pcStack_5108 = (code *)0x133e73;
    cVar1 = bcon_extract(auStack_5100,"x",uVar5,9,0);
    if (cVar1 != '\0') {
      pcStack_5108 = (code *)0x133e7f;
      bson_destroy(auStack_5100);
      return;
    }
  }
  pcStack_5108 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_5508 = (code *)0x0;
  pcStack_5510 = "}";
  acStack_5520[8] = -0x2e;
  acStack_5520[9] = '>';
  acStack_5520[10] = '\x13';
  acStack_5520[0xb] = '\0';
  acStack_5520[0xc] = '\0';
  acStack_5520[0xd] = '\0';
  acStack_5520[0xe] = '\0';
  acStack_5520[0xf] = '\0';
  piStack_5130 = __haystack;
  pcStack_5128 = pcVar6;
  ppuStack_5120 = ppuVar26;
  puStack_5118 = puVar13;
  ppuStack_5110 = ppuVar22;
  pcStack_5108 = (code *)apcStack_4d88;
  uVar20 = bcon_new(0,"a","{","b","{");
  uStack_5410 = 0;
  uStack_5408 = 0;
  uStack_5420 = 0;
  uStack_5418 = 0;
  uStack_5430 = 0;
  uStack_5428 = 0;
  uStack_5440 = 0;
  uStack_5438 = 0;
  uStack_5450 = 0;
  uStack_5448 = 0;
  uStack_5460 = 0;
  uStack_5458 = 0;
  uStack_5470 = 0;
  uStack_5468 = 0;
  uStack_5480 = (undefined *)0x500000003;
  uStack_5478 = 5;
  pcStack_5508 = (code *)0x133f2f;
  cVar1 = bson_init_from_json(&uStack_5480,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_53b8);
  if (cVar1 != '\0') {
    pcStack_5508 = (code *)0x133f47;
    ppuVar22 = (undefined **)bson_get_data(&uStack_5480);
    pcStack_5508 = (code *)0x133f52;
    puVar13 = (undefined1 *)bson_get_data(uVar20);
    if (*(int *)(uVar20 + 4) == uStack_5480._4_4_) {
      pcStack_5508 = (code *)0x133f67;
      pvVar10 = (void *)bson_get_data(uVar20);
      pcStack_5508 = (code *)0x133f77;
      pvVar11 = (void *)bson_get_data(&uStack_5480);
      pcStack_5508 = (code *)0x133f85;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar20 + 4));
      if (iVar2 == 0) {
        pcStack_5508 = (code *)0x133f96;
        bson_destroy(&uStack_5480);
        pcStack_5508 = (code *)0x133f9e;
        bson_destroy(uVar20);
        return;
      }
    }
    ppuVar26 = (undefined **)&uStack_5480;
    pcStack_5508 = (code *)0x133fbf;
    pcVar6 = (char *)bson_as_canonical_extended_json(ppuVar26);
    pcStack_5508 = (code *)0x133fcc;
    uVar5 = bson_as_canonical_extended_json(uVar20);
    uVar3 = *(uint *)(uVar20 + 4);
    if (uStack_5480._4_4_ != 0) {
      uVar21 = 0;
      do {
        if (uVar3 == (uint)uVar21) break;
        if (*(char *)((long)ppuVar22 + uVar21) != puVar13[uVar21]) goto LAB_0013409c;
        uVar21 = uVar21 + 1;
      } while (uStack_5480._4_4_ != (uint)uVar21);
    }
    uVar4 = uStack_5480._4_4_;
    if (uStack_5480._4_4_ < uVar3) {
      uVar4 = uVar3;
    }
    uVar21 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_5508 = (code *)0x134018;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar21,pcVar6,uVar5);
      pcStack_5508 = (code *)0x134030;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      pcVar6 = (char *)(ulong)uVar3;
      pcStack_5508 = (code *)0x13404b;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_5484 = uVar3;
      if (uVar3 == 0xffffffff) break;
      ppuVar26 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_001340a8;
      pcVar6 = (char *)((ulong)uStack_5480 >> 0x20);
      pcStack_5508 = (code *)0x134075;
      pcVar19 = (char *)write(uVar3,ppuVar22,(size_t)pcVar6);
      if (pcVar19 != pcVar6) goto LAB_001340ad;
      uVar20 = (ulong)*(uint *)(uVar20 + 4);
      pcStack_5508 = (code *)0x13408b;
      uVar21 = write(uVar4,puVar13,uVar20);
      if (uVar21 != uVar20) goto LAB_001340b2;
      uVar21 = (ulong)uVar4;
      pcStack_5508 = (code *)0x13409c;
      test_bson_json_empty_final_object_cold_4();
      uVar5 = extraout_RAX_03;
LAB_0013409c:
      uVar21 = uVar21 & 0xffffffff;
    }
    pcStack_5508 = (code *)0x1340a8;
    test_bson_json_empty_final_object_cold_6();
LAB_001340a8:
    pcStack_5508 = (code *)0x1340ad;
    test_bson_json_empty_final_object_cold_5();
LAB_001340ad:
    pcStack_5508 = (code *)0x1340b2;
    test_bson_json_empty_final_object_cold_2();
LAB_001340b2:
    pcStack_5508 = (code *)0x1340b7;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_5508 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar19 = acStack_5520;
  acStack_5520[8] = '\0';
  acStack_5520[9] = '\0';
  acStack_5520[10] = '\0';
  acStack_5520[0xb] = '\0';
  acStack_5520[0xc] = '\0';
  acStack_5520[0xd] = '\0';
  acStack_5520[0xe] = '@';
  acStack_5520[0xf] = '0';
  acStack_5520[0] = '\v';
  acStack_5520[1] = '\0';
  acStack_5520[2] = '\0';
  acStack_5520[3] = '\0';
  acStack_5520[4] = '\0';
  acStack_5520[5] = '\0';
  acStack_5520[6] = '\0';
  acStack_5520[7] = '\0';
  pcStack_5530 = (code *)0x1340ea;
  pcStack_5510 = (char *)uVar20;
  pcStack_5508 = (code *)puVar13;
  plVar16 = (long *)bson_new();
  pcStack_5530 = (code *)0x134104;
  cVar1 = bson_append_decimal128(plVar16,"decimal128",0xffffffff,pcVar19);
  if (cVar1 == '\0') {
    pcStack_5530 = (code *)0x134152;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_5530 = (code *)0x134113;
    pcVar19 = (char *)bson_as_json(plVar16,auStack_5528);
    if (pcVar19 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00134135:
      pcStack_5530 = (code *)0x13413d;
      bson_free(pcVar19);
      pcStack_5530 = (code *)0x134145;
      bson_destroy(plVar16);
      return;
    }
    pcStack_5530 = (code *)0x134131;
    iVar2 = strcmp(pcVar19,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00134135;
  }
  pcStack_5530 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar30 = &pcStack_5530;
  ppuStack_5988 = (undefined **)0x13418d;
  plStack_5538 = plVar16;
  pcStack_5530 = (code *)&pcStack_5108;
  cVar1 = bson_init_from_json(auStack_5880,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_5798);
  if (cVar1 == '\0') goto LAB_00134231;
  ppuStack_5988 = (undefined **)0x1341aa;
  cVar1 = bson_iter_init(auStack_5900,auStack_5880);
  if (cVar1 == '\0') {
    ppuStack_5988 = (undefined **)0x13421d;
    test_bson_json_number_decimal_cold_2();
LAB_0013421d:
    ppuStack_5988 = (undefined **)0x134222;
    test_bson_json_number_decimal_cold_3();
LAB_00134222:
    ppuStack_5988 = (undefined **)0x134227;
    test_bson_json_number_decimal_cold_4();
LAB_00134227:
    ppuStack_5988 = (undefined **)0x13422c;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    ppuStack_5988 = (undefined **)0x1341c2;
    cVar1 = bson_iter_find(auStack_5900,"key");
    if (cVar1 == '\0') goto LAB_0013421d;
    ppuStack_5988 = (undefined **)0x1341d3;
    iVar2 = bson_iter_type(auStack_5900);
    if (iVar2 != 0x13) goto LAB_00134222;
    plVar16 = &lStack_5910;
    ppuStack_5988 = (undefined **)0x1341ed;
    bson_iter_decimal128(auStack_5900,plVar16);
    if (lStack_5910 != 0xb) goto LAB_00134227;
    if (lStack_5908 == 0x3040000000000000) {
      ppuStack_5988 = (undefined **)0x134211;
      bson_destroy(auStack_5880);
      return;
    }
  }
  ppuStack_5988 = (undefined **)0x134231;
  test_bson_json_number_decimal_cold_6();
LAB_00134231:
  ppuStack_5988 = (undefined **)test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar8 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar24 = &PTR_anon_var_dwarf_1b1c7_00163470;
  plStack_59a0 = plVar16;
  pcStack_5998 = pcVar6;
  pcStack_5990 = pcVar19;
  ppuStack_5988 = ppuVar22;
  do {
    pcStack_5bb0 = (code *)0x134273;
    lVar7 = bson_new_from_json(pcVar8,0xffffffffffffffff,&iStack_5ba0);
    if (lVar7 != 0) {
      pcStack_5bb0 = (code *)0x1342c0;
      test_bson_json_errors_cold_1();
LAB_001342c0:
      pcStack_5bb0 = (code *)0x1342de;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_5b98,
              ppuVar22);
      pcStack_5bb0 = (code *)0x1342e3;
      abort();
    }
    if (iStack_5ba0 != 1) {
LAB_001342e8:
      pcStack_5bb0 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_5dc8 = (code *)0x13430d;
      pcStack_5bb8 = acStack_5b98;
      pcStack_5bb0 = (code *)&iStack_5ba0;
      pcVar6 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                          auStack_5db8);
      pcStack_5dc8 = (code *)0x13431a;
      pcVar19 = (char *)bson_as_json(pcVar6,0);
      if (pcVar19 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_0013433c:
        pcStack_5dc8 = (code *)0x134344;
        bson_free(pcVar19);
        pcStack_5dc8 = (code *)0x13434c;
        bson_destroy(pcVar6);
        return;
      }
      pcStack_5dc8 = (code *)0x134338;
      iVar2 = strcmp(pcVar19,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_0013433c;
      pcStack_5dc8 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_5fd8 = 0x2200223a2261227b;
      uStack_5fd0 = 0x7d;
      uStack_5fdc = 0x227b;
      pcStack_5dc8 = (code *)pcVar6;
      lVar7 = bson_new_from_json(&uStack_5fd8,9,&iStack_5fc8);
      if (lVar7 == 0) {
        if (iStack_5fc8 != 1) goto LAB_00134418;
        if (iStack_5fc4 != 1) goto LAB_0013441d;
        pcVar6 = acStack_5fc0;
        pcVar8 = strstr(pcVar6,"Got parse error");
        if (pcVar8 == (char *)0x0) goto LAB_00134422;
        lVar7 = bson_new_from_json(&uStack_5fdc,3,&iStack_5fc8);
        if (lVar7 != 0) goto LAB_00134413;
        if (iStack_5fc8 != 1) goto LAB_0013442a;
        if (iStack_5fc4 == 1) {
          pcVar8 = strstr(pcVar6,"Got parse error");
          if (pcVar8 != (char *)0x0) {
            return;
          }
          goto LAB_00134434;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_00134413:
        test_bson_json_null_in_str_cold_4();
LAB_00134418:
        test_bson_json_null_in_str_cold_2();
LAB_0013441d:
        test_bson_json_null_in_str_cold_3();
LAB_00134422:
        test_bson_json_null_in_str_cold_8();
LAB_0013442a:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00134434:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX_04;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar9 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0,uVar5,pcVar6,ppuVar24,ppuVar26,pcVar19,ppuVar22,ppcVar30)
      ;
      uVar17 = bcon_new(0,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar17,0);
      uVar5 = bson_new();
      uVar17 = bson_new();
      uVar18 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar17,uVar18,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar9,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_5b9c != 2) {
      pcStack_5bb0 = (code *)0x1342e8;
      test_bson_json_errors_cold_3();
      goto LAB_001342e8;
    }
    ppuVar22 = (undefined **)ppuVar24[-1];
    pcStack_5bb0 = (code *)0x13429a;
    pcVar6 = strstr(acStack_5b98,(char *)ppuVar22);
    if (pcVar6 == (char *)0x0) goto LAB_001342c0;
    pcVar8 = *ppuVar24;
    ppuVar24 = ppuVar24 + 2;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00133b35:
  apcStack_4988[0] = (code *)0x133b3a;
  test_bson_json_nan_cold_11();
  goto LAB_00133b3a;
LAB_00133ddf:
  apcStack_4d88[0] = (code *)0x133de4;
  test_bson_json_infinity_cold_4();
LAB_00133de4:
  apcStack_4d88[0] = (code *)0x133de9;
  test_bson_json_infinity_cold_5();
LAB_00133de9:
  apcStack_4d88[0] = (code *)0x133dee;
  test_bson_json_infinity_cold_6();
LAB_00133dee:
  ppuVar26 = &puStack_4d08;
  pcVar6 = "d";
  apcStack_4d88[0] = (code *)0x133df3;
  test_bson_json_infinity_cold_7();
LAB_00133df3:
  apcStack_4d88[0] = (code *)0x133df8;
  test_bson_json_infinity_cold_15();
  goto LAB_00133df8;
}

Assistant:

static void
test_bson_json_read_legacy_regex (void)
{
   bson_t b;
   bson_error_t error;
   bool r;
   const char *pattern;
   const char *flags;

   r = bson_init_from_json (
      &b, "{\"a\": {\"$regex\": \"abc\", \"$options\": \"ix\"}}", -1, &error);
   ASSERT_OR_PRINT (r, error);
   BCON_EXTRACT (&b, "a", BCONE_REGEX (pattern, flags));
   ASSERT_CMPSTR (pattern, "abc");
   ASSERT_CMPSTR (flags, "ix");

   bson_destroy (&b);

   r = bson_init_from_json (&b, "{\"a\": {\"$regex\": \"abc\"}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"$options\" after \"$regex\"");

   r = bson_init_from_json (&b, "{\"a\": {\"$options\": \"ix\"}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"$regex\" after \"$options\"");
}